

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx2::CurveNiMBIntersectorK<8,4>::
     intersect_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  bool bVar86;
  undefined1 auVar87 [32];
  bool bVar88;
  undefined1 auVar89 [32];
  bool bVar90;
  bool bVar91;
  bool bVar92;
  bool bVar93;
  bool bVar94;
  bool bVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [28];
  uint uVar108;
  uint uVar109;
  ulong uVar110;
  uint uVar111;
  long lVar112;
  ulong uVar113;
  long lVar114;
  undefined1 auVar115 [8];
  undefined4 uVar116;
  undefined8 uVar117;
  float fVar136;
  undefined1 auVar118 [16];
  float fVar134;
  undefined1 auVar119 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar135;
  float fVar137;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar142 [16];
  float fVar141;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar143 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar160;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar159 [32];
  undefined1 extraout_var [56];
  float fVar161;
  float fVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar219 [16];
  float fVar205;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  undefined4 uVar224;
  undefined1 auVar225 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  float fVar228;
  float fVar229;
  float fVar233;
  undefined1 auVar230 [16];
  undefined8 uVar234;
  undefined8 uVar235;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined8 uVar236;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  float fVar242;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar243 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  Precalculations *local_868;
  undefined1 local_860 [32];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [48];
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [32];
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 (*local_6e8) [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  undefined1 auStack_6b8 [8];
  undefined1 auStack_6b0 [8];
  float fStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  LinearSpace3fa *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 auStack_530 [8];
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  int local_340;
  int local_33c;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2e0 [32];
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  uint local_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar11 = prim[1];
  uVar110 = (ulong)(byte)PVar11;
  lVar22 = uVar110 * 0x25;
  auVar219 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar219 = vinsertps_avx(auVar219,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar186 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar186 = vinsertps_avx(auVar186,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar162 = *(float *)(prim + lVar22 + 0x12);
  auVar219 = vsubps_avx(auVar219,*(undefined1 (*) [16])(prim + lVar22 + 6));
  auVar118._0_4_ = fVar162 * auVar219._0_4_;
  auVar118._4_4_ = fVar162 * auVar219._4_4_;
  auVar118._8_4_ = fVar162 * auVar219._8_4_;
  auVar118._12_4_ = fVar162 * auVar219._12_4_;
  auVar163._0_4_ = fVar162 * auVar186._0_4_;
  auVar163._4_4_ = fVar162 * auVar186._4_4_;
  auVar163._8_4_ = fVar162 * auVar186._8_4_;
  auVar163._12_4_ = fVar162 * auVar186._12_4_;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = *(ulong *)(prim + uVar110 * 4 + 6);
  auVar147 = vpmovsxbd_avx2(auVar219);
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar110 * 5 + 6);
  auVar130 = vpmovsxbd_avx2(auVar186);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar110 * 6 + 6);
  auVar20 = vpmovsxbd_avx2(auVar5);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar110 * 0xf + 6);
  auVar128 = vpmovsxbd_avx2(auVar6);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar131 = vpmovsxbd_avx2(auVar202);
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar110 + 6);
  auVar178 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar110 * 0x1a + 6);
  auVar222 = vpmovsxbd_avx2(auVar8);
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar110 * 0x1b + 6);
  auVar177 = vpmovsxbd_avx2(auVar9);
  auVar222 = vcvtdq2ps_avx(auVar222);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar110 * 0x1c + 6);
  auVar21 = vpmovsxbd_avx2(auVar10);
  auVar213 = vcvtdq2ps_avx(auVar177);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar237._4_4_ = auVar163._0_4_;
  auVar237._0_4_ = auVar163._0_4_;
  auVar237._8_4_ = auVar163._0_4_;
  auVar237._12_4_ = auVar163._0_4_;
  auVar237._16_4_ = auVar163._0_4_;
  auVar237._20_4_ = auVar163._0_4_;
  auVar237._24_4_ = auVar163._0_4_;
  auVar237._28_4_ = auVar163._0_4_;
  auVar219 = vmovshdup_avx(auVar163);
  uVar117 = auVar219._0_8_;
  auVar249._8_8_ = uVar117;
  auVar249._0_8_ = uVar117;
  auVar249._16_8_ = uVar117;
  auVar249._24_8_ = uVar117;
  auVar219 = vshufps_avx(auVar163,auVar163,0xaa);
  fVar162 = auVar219._0_4_;
  auVar216._0_4_ = fVar162 * auVar20._0_4_;
  fVar134 = auVar219._4_4_;
  auVar216._4_4_ = fVar134 * auVar20._4_4_;
  auVar216._8_4_ = fVar162 * auVar20._8_4_;
  auVar216._12_4_ = fVar134 * auVar20._12_4_;
  auVar216._16_4_ = fVar162 * auVar20._16_4_;
  auVar216._20_4_ = fVar134 * auVar20._20_4_;
  auVar216._28_36_ = in_ZMM10._28_36_;
  auVar216._24_4_ = fVar162 * auVar20._24_4_;
  auVar176._4_4_ = auVar178._4_4_ * fVar134;
  auVar176._0_4_ = auVar178._0_4_ * fVar162;
  auVar176._8_4_ = auVar178._8_4_ * fVar162;
  auVar176._12_4_ = auVar178._12_4_ * fVar134;
  auVar176._16_4_ = auVar178._16_4_ * fVar162;
  auVar176._20_4_ = auVar178._20_4_ * fVar134;
  auVar176._24_4_ = auVar178._24_4_ * fVar162;
  auVar176._28_4_ = auVar177._28_4_;
  auVar210._0_4_ = auVar21._0_4_ * fVar162;
  auVar210._4_4_ = auVar21._4_4_ * fVar134;
  auVar210._8_4_ = auVar21._8_4_ * fVar162;
  auVar210._12_4_ = auVar21._12_4_ * fVar134;
  auVar210._16_4_ = auVar21._16_4_ * fVar162;
  auVar210._20_4_ = auVar21._20_4_ * fVar134;
  auVar210._24_4_ = auVar21._24_4_ * fVar162;
  auVar210._28_4_ = 0;
  auVar219 = vfmadd231ps_fma(auVar216._0_32_,auVar249,auVar130);
  auVar186 = vfmadd231ps_fma(auVar176,auVar249,auVar131);
  auVar5 = vfmadd231ps_fma(auVar210,auVar213,auVar249);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar219),auVar237,auVar147);
  auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar237,auVar128);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar222,auVar237);
  auVar238._4_4_ = auVar118._0_4_;
  auVar238._0_4_ = auVar118._0_4_;
  auVar238._8_4_ = auVar118._0_4_;
  auVar238._12_4_ = auVar118._0_4_;
  auVar238._16_4_ = auVar118._0_4_;
  auVar238._20_4_ = auVar118._0_4_;
  auVar238._24_4_ = auVar118._0_4_;
  auVar238._28_4_ = auVar118._0_4_;
  auVar219 = vmovshdup_avx(auVar118);
  uVar117 = auVar219._0_8_;
  auVar250._8_8_ = uVar117;
  auVar250._0_8_ = uVar117;
  auVar250._16_8_ = uVar117;
  auVar250._24_8_ = uVar117;
  auVar219 = vshufps_avx(auVar118,auVar118,0xaa);
  fVar162 = auVar219._0_4_;
  auVar122._0_4_ = fVar162 * auVar20._0_4_;
  fVar134 = auVar219._4_4_;
  auVar122._4_4_ = fVar134 * auVar20._4_4_;
  auVar122._8_4_ = fVar162 * auVar20._8_4_;
  auVar122._12_4_ = fVar134 * auVar20._12_4_;
  auVar122._16_4_ = fVar162 * auVar20._16_4_;
  auVar122._20_4_ = fVar134 * auVar20._20_4_;
  auVar122._24_4_ = fVar162 * auVar20._24_4_;
  auVar122._28_4_ = 0;
  auVar177._4_4_ = auVar178._4_4_ * fVar134;
  auVar177._0_4_ = auVar178._0_4_ * fVar162;
  auVar177._8_4_ = auVar178._8_4_ * fVar162;
  auVar177._12_4_ = auVar178._12_4_ * fVar134;
  auVar177._16_4_ = auVar178._16_4_ * fVar162;
  auVar177._20_4_ = auVar178._20_4_ * fVar134;
  auVar177._24_4_ = auVar178._24_4_ * fVar162;
  auVar177._28_4_ = auVar20._28_4_;
  auVar20._4_4_ = auVar21._4_4_ * fVar134;
  auVar20._0_4_ = auVar21._0_4_ * fVar162;
  auVar20._8_4_ = auVar21._8_4_ * fVar162;
  auVar20._12_4_ = auVar21._12_4_ * fVar134;
  auVar20._16_4_ = auVar21._16_4_ * fVar162;
  auVar20._20_4_ = auVar21._20_4_ * fVar134;
  auVar20._24_4_ = auVar21._24_4_ * fVar162;
  auVar20._28_4_ = fVar134;
  auVar219 = vfmadd231ps_fma(auVar122,auVar250,auVar130);
  auVar202 = vfmadd231ps_fma(auVar177,auVar250,auVar131);
  auVar7 = vfmadd231ps_fma(auVar20,auVar250,auVar213);
  auVar118 = vfmadd231ps_fma(ZEXT1632(auVar219),auVar238,auVar147);
  local_1a0._8_4_ = 0x7fffffff;
  local_1a0._0_8_ = 0x7fffffff7fffffff;
  local_1a0._12_4_ = 0x7fffffff;
  local_1a0._16_4_ = 0x7fffffff;
  local_1a0._20_4_ = 0x7fffffff;
  local_1a0._24_4_ = 0x7fffffff;
  local_1a0._28_4_ = 0x7fffffff;
  auVar187._8_4_ = 0x219392ef;
  auVar187._0_8_ = 0x219392ef219392ef;
  auVar187._12_4_ = 0x219392ef;
  auVar187._16_4_ = 0x219392ef;
  auVar187._20_4_ = 0x219392ef;
  auVar187._24_4_ = 0x219392ef;
  auVar187._28_4_ = 0x219392ef;
  auVar147 = vandps_avx(ZEXT1632(auVar6),local_1a0);
  auVar147 = vcmpps_avx(auVar147,auVar187,1);
  auVar130 = vblendvps_avx(ZEXT1632(auVar6),auVar187,auVar147);
  auVar147 = vandps_avx(ZEXT1632(auVar186),local_1a0);
  auVar147 = vcmpps_avx(auVar147,auVar187,1);
  auVar20 = vblendvps_avx(ZEXT1632(auVar186),auVar187,auVar147);
  auVar147 = vandps_avx(ZEXT1632(auVar5),local_1a0);
  auVar147 = vcmpps_avx(auVar147,auVar187,1);
  auVar147 = vblendvps_avx(ZEXT1632(auVar5),auVar187,auVar147);
  auVar163 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar238,auVar128);
  auVar128 = vrcpps_avx(auVar130);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar238,auVar222);
  auVar211._8_4_ = 0x3f800000;
  auVar211._0_8_ = &DAT_3f8000003f800000;
  auVar211._12_4_ = 0x3f800000;
  auVar211._16_4_ = 0x3f800000;
  auVar211._20_4_ = 0x3f800000;
  auVar211._24_4_ = 0x3f800000;
  auVar211._28_4_ = 0x3f800000;
  auVar219 = vfnmadd213ps_fma(auVar130,auVar128,auVar211);
  auVar219 = vfmadd132ps_fma(ZEXT1632(auVar219),auVar128,auVar128);
  auVar130 = vrcpps_avx(auVar20);
  auVar186 = vfnmadd213ps_fma(auVar20,auVar130,auVar211);
  auVar20 = vrcpps_avx(auVar147);
  auVar186 = vfmadd132ps_fma(ZEXT1632(auVar186),auVar130,auVar130);
  auVar5 = vfnmadd213ps_fma(auVar147,auVar20,auVar211);
  auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar20,auVar20);
  fVar162 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 * 7 + 6));
  auVar200._4_4_ = fVar162;
  auVar200._0_4_ = fVar162;
  auVar200._8_4_ = fVar162;
  auVar200._12_4_ = fVar162;
  auVar200._16_4_ = fVar162;
  auVar200._20_4_ = fVar162;
  auVar200._24_4_ = fVar162;
  auVar200._28_4_ = fVar162;
  auVar130 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 * 0xb + 6));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar130 = vsubps_avx(auVar130,auVar147);
  auVar6 = vfmadd213ps_fma(auVar130,auVar200,auVar147);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 * 9 + 6));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar130 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 * 0xd + 6));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar130 = vsubps_avx(auVar130,auVar147);
  auVar202 = vfmadd213ps_fma(auVar130,auVar200,auVar147);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 * 0x12 + 6));
  uVar113 = (ulong)(uint)((int)(uVar110 * 5) << 2);
  auVar130 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 * 2 + uVar113 + 6));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar130 = vsubps_avx(auVar130,auVar147);
  auVar7 = vfmadd213ps_fma(auVar130,auVar200,auVar147);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar113 + 6));
  auVar130 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 * 0x18 + 6));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar130 = vsubps_avx(auVar130,auVar147);
  auVar8 = vfmadd213ps_fma(auVar130,auVar200,auVar147);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 * 0x1d + 6));
  auVar130 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 + (ulong)(byte)PVar11 * 0x20 + 6))
  ;
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar130 = vsubps_avx(auVar130,auVar147);
  auVar9 = vfmadd213ps_fma(auVar130,auVar200,auVar147);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + ((ulong)(byte)PVar11 * 0x20 - uVar110) + 6));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar130 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 * 0x23 + 6));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar130 = vsubps_avx(auVar130,auVar147);
  auVar10 = vfmadd213ps_fma(auVar130,auVar200,auVar147);
  auVar147 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar118));
  auVar128._4_4_ = auVar219._4_4_ * auVar147._4_4_;
  auVar128._0_4_ = auVar219._0_4_ * auVar147._0_4_;
  auVar128._8_4_ = auVar219._8_4_ * auVar147._8_4_;
  auVar128._12_4_ = auVar219._12_4_ * auVar147._12_4_;
  auVar128._16_4_ = auVar147._16_4_ * 0.0;
  auVar128._20_4_ = auVar147._20_4_ * 0.0;
  auVar128._24_4_ = auVar147._24_4_ * 0.0;
  auVar128._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(ZEXT1632(auVar202),ZEXT1632(auVar118));
  auVar131._4_4_ = auVar219._4_4_ * auVar147._4_4_;
  auVar131._0_4_ = auVar219._0_4_ * auVar147._0_4_;
  auVar131._8_4_ = auVar219._8_4_ * auVar147._8_4_;
  auVar131._12_4_ = auVar219._12_4_ * auVar147._12_4_;
  auVar131._16_4_ = auVar147._16_4_ * 0.0;
  auVar131._20_4_ = auVar147._20_4_ * 0.0;
  auVar131._24_4_ = auVar147._24_4_ * 0.0;
  auVar131._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar163));
  auVar178._4_4_ = auVar186._4_4_ * auVar147._4_4_;
  auVar178._0_4_ = auVar186._0_4_ * auVar147._0_4_;
  auVar178._8_4_ = auVar186._8_4_ * auVar147._8_4_;
  auVar178._12_4_ = auVar186._12_4_ * auVar147._12_4_;
  auVar178._16_4_ = auVar147._16_4_ * 0.0;
  auVar178._20_4_ = auVar147._20_4_ * 0.0;
  auVar178._24_4_ = auVar147._24_4_ * 0.0;
  auVar178._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar163));
  auVar222._4_4_ = auVar186._4_4_ * auVar147._4_4_;
  auVar222._0_4_ = auVar186._0_4_ * auVar147._0_4_;
  auVar222._8_4_ = auVar186._8_4_ * auVar147._8_4_;
  auVar222._12_4_ = auVar186._12_4_ * auVar147._12_4_;
  auVar222._16_4_ = auVar147._16_4_ * 0.0;
  auVar222._20_4_ = auVar147._20_4_ * 0.0;
  auVar222._24_4_ = auVar147._24_4_ * 0.0;
  auVar222._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar23));
  auVar213._4_4_ = auVar5._4_4_ * auVar147._4_4_;
  auVar213._0_4_ = auVar5._0_4_ * auVar147._0_4_;
  auVar213._8_4_ = auVar5._8_4_ * auVar147._8_4_;
  auVar213._12_4_ = auVar5._12_4_ * auVar147._12_4_;
  auVar213._16_4_ = auVar147._16_4_ * 0.0;
  auVar213._20_4_ = auVar147._20_4_ * 0.0;
  auVar213._24_4_ = auVar147._24_4_ * 0.0;
  auVar213._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar23));
  auVar21._4_4_ = auVar5._4_4_ * auVar147._4_4_;
  auVar21._0_4_ = auVar5._0_4_ * auVar147._0_4_;
  auVar21._8_4_ = auVar5._8_4_ * auVar147._8_4_;
  auVar21._12_4_ = auVar5._12_4_ * auVar147._12_4_;
  auVar21._16_4_ = auVar147._16_4_ * 0.0;
  auVar21._20_4_ = auVar147._20_4_ * 0.0;
  auVar21._24_4_ = auVar147._24_4_ * 0.0;
  auVar21._28_4_ = auVar147._28_4_;
  auVar147 = vpminsd_avx2(auVar128,auVar131);
  auVar130 = vpminsd_avx2(auVar178,auVar222);
  auVar147 = vmaxps_avx(auVar147,auVar130);
  auVar130 = vpminsd_avx2(auVar213,auVar21);
  uVar116 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar212._4_4_ = uVar116;
  auVar212._0_4_ = uVar116;
  auVar212._8_4_ = uVar116;
  auVar212._12_4_ = uVar116;
  auVar212._16_4_ = uVar116;
  auVar212._20_4_ = uVar116;
  auVar212._24_4_ = uVar116;
  auVar212._28_4_ = uVar116;
  auVar130 = vmaxps_avx(auVar130,auVar212);
  auVar147 = vmaxps_avx(auVar147,auVar130);
  local_80._4_4_ = auVar147._4_4_ * 0.99999964;
  local_80._0_4_ = auVar147._0_4_ * 0.99999964;
  local_80._8_4_ = auVar147._8_4_ * 0.99999964;
  local_80._12_4_ = auVar147._12_4_ * 0.99999964;
  local_80._16_4_ = auVar147._16_4_ * 0.99999964;
  local_80._20_4_ = auVar147._20_4_ * 0.99999964;
  local_80._24_4_ = auVar147._24_4_ * 0.99999964;
  local_80._28_4_ = auVar147._28_4_;
  auVar147 = vpmaxsd_avx2(auVar128,auVar131);
  auVar130 = vpmaxsd_avx2(auVar178,auVar222);
  auVar147 = vminps_avx(auVar147,auVar130);
  auVar130 = vpmaxsd_avx2(auVar213,auVar21);
  uVar116 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar149._4_4_ = uVar116;
  auVar149._0_4_ = uVar116;
  auVar149._8_4_ = uVar116;
  auVar149._12_4_ = uVar116;
  auVar149._16_4_ = uVar116;
  auVar149._20_4_ = uVar116;
  auVar149._24_4_ = uVar116;
  auVar149._28_4_ = uVar116;
  auVar130 = vminps_avx(auVar130,auVar149);
  auVar147 = vminps_avx(auVar147,auVar130);
  auVar120._4_4_ = auVar147._4_4_ * 1.0000004;
  auVar120._0_4_ = auVar147._0_4_ * 1.0000004;
  auVar120._8_4_ = auVar147._8_4_ * 1.0000004;
  auVar120._12_4_ = auVar147._12_4_ * 1.0000004;
  auVar120._16_4_ = auVar147._16_4_ * 1.0000004;
  auVar120._20_4_ = auVar147._20_4_ * 1.0000004;
  auVar120._24_4_ = auVar147._24_4_ * 1.0000004;
  auVar120._28_4_ = auVar147._28_4_;
  auVar147._1_3_ = 0;
  auVar147[0] = PVar11;
  auVar147[4] = PVar11;
  auVar147._5_3_ = 0;
  auVar147[8] = PVar11;
  auVar147._9_3_ = 0;
  auVar147[0xc] = PVar11;
  auVar147._13_3_ = 0;
  auVar147[0x10] = PVar11;
  auVar147._17_3_ = 0;
  auVar147[0x14] = PVar11;
  auVar147._21_3_ = 0;
  auVar147[0x18] = PVar11;
  auVar147._25_3_ = 0;
  auVar147[0x1c] = PVar11;
  auVar147._29_3_ = 0;
  auVar130 = vpcmpgtd_avx2(auVar147,_DAT_0205a920);
  auVar147 = vcmpps_avx(local_80,auVar120,2);
  auVar147 = vandps_avx(auVar147,auVar130);
  uVar108 = vmovmskps_avx(auVar147);
  if (uVar108 != 0) {
    uVar108 = uVar108 & 0xff;
    local_5c8 = pre->ray_space + k;
    local_5c0 = mm_lookupmask_ps._16_8_;
    uStack_5b8 = mm_lookupmask_ps._24_8_;
    uStack_5b0 = mm_lookupmask_ps._16_8_;
    uStack_5a8 = mm_lookupmask_ps._24_8_;
    local_6e8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    local_1b0 = 0x7fffffff;
    uStack_1ac = 0x7fffffff;
    uStack_1a8 = 0x7fffffff;
    uStack_1a4 = 0x7fffffff;
    local_868 = pre;
    do {
      lVar22 = 0;
      for (uVar110 = (ulong)uVar108; (uVar110 & 1) == 0; uVar110 = uVar110 >> 1 | 0x8000000000000000
          ) {
        lVar22 = lVar22 + 1;
      }
      uVar12 = *(uint *)(prim + 2);
      uVar13 = *(uint *)(prim + lVar22 * 4 + 6);
      pGVar15 = (context->scene->geometries).items[uVar12].ptr;
      uVar110 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                                (ulong)uVar13 *
                                pGVar15[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar162 = (pGVar15->time_range).lower;
      fVar162 = pGVar15->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar162) /
                ((pGVar15->time_range).upper - fVar162));
      auVar219 = vroundss_avx(ZEXT416((uint)fVar162),ZEXT416((uint)fVar162),9);
      auVar219 = vminss_avx(auVar219,ZEXT416((uint)(pGVar15->fnumTimeSegments + -1.0)));
      auVar219 = vmaxss_avx(ZEXT816(0) << 0x20,auVar219);
      fVar162 = fVar162 - auVar219._0_4_;
      fVar134 = 1.0 - fVar162;
      _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar112 = (long)(int)auVar219._0_4_ * 0x38;
      lVar114 = *(long *)(_Var16 + 0x10 + lVar112);
      lVar17 = *(long *)(_Var16 + 0x38 + lVar112);
      lVar18 = *(long *)(_Var16 + 0x48 + lVar112);
      pfVar1 = (float *)(lVar17 + lVar18 * uVar110);
      auVar164._0_4_ = fVar162 * *pfVar1;
      auVar164._4_4_ = fVar162 * pfVar1[1];
      auVar164._8_4_ = fVar162 * pfVar1[2];
      auVar164._12_4_ = fVar162 * pfVar1[3];
      lVar22 = uVar110 + 1;
      pfVar1 = (float *)(lVar17 + lVar18 * lVar22);
      auVar181._0_4_ = fVar162 * *pfVar1;
      auVar181._4_4_ = fVar162 * pfVar1[1];
      auVar181._8_4_ = fVar162 * pfVar1[2];
      auVar181._12_4_ = fVar162 * pfVar1[3];
      p_Var19 = pGVar15[4].occlusionFilterN;
      auVar119._4_4_ = fVar134;
      auVar119._0_4_ = fVar134;
      auVar119._8_4_ = fVar134;
      auVar119._12_4_ = fVar134;
      auVar7 = vfmadd231ps_fma(auVar164,auVar119,
                               *(undefined1 (*) [16])
                                (*(long *)(_Var16 + lVar112) + lVar114 * uVar110));
      _local_700 = vfmadd231ps_fma(auVar181,auVar119,
                                   *(undefined1 (*) [16])
                                    (*(long *)(_Var16 + lVar112) + lVar114 * lVar22));
      pfVar1 = (float *)(*(long *)(p_Var19 + lVar112 + 0x38) +
                        uVar110 * *(long *)(p_Var19 + lVar112 + 0x48));
      auVar182._0_4_ = fVar162 * *pfVar1;
      auVar182._4_4_ = fVar162 * pfVar1[1];
      auVar182._8_4_ = fVar162 * pfVar1[2];
      auVar182._12_4_ = fVar162 * pfVar1[3];
      pfVar1 = (float *)(*(long *)(p_Var19 + lVar112 + 0x38) +
                        *(long *)(p_Var19 + lVar112 + 0x48) * lVar22);
      auVar142._0_4_ = fVar162 * *pfVar1;
      auVar142._4_4_ = fVar162 * pfVar1[1];
      auVar142._8_4_ = fVar162 * pfVar1[2];
      auVar142._12_4_ = fVar162 * pfVar1[3];
      auVar186 = vfmadd231ps_fma(auVar182,auVar119,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var19 + lVar112) +
                                  *(long *)(p_Var19 + lVar112 + 0x10) * uVar110));
      auVar5 = vfmadd231ps_fma(auVar142,auVar119,
                               *(undefined1 (*) [16])
                                (*(long *)(p_Var19 + lVar112) +
                                *(long *)(p_Var19 + lVar112 + 0x10) * lVar22));
      iVar14 = (int)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar22 = (long)iVar14 * 0x44;
      auVar219 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar6 = vinsertps_avx(auVar219,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar143._8_4_ = 0xbeaaaaab;
      auVar143._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar143._12_4_ = 0xbeaaaaab;
      local_710 = vfnmadd213ps_fma(auVar186,auVar143,auVar7);
      local_720 = vfmadd213ps_fma(auVar5,auVar143,_local_700);
      auVar186 = vsubps_avx(auVar7,auVar6);
      uVar116 = auVar186._0_4_;
      auVar165._4_4_ = uVar116;
      auVar165._0_4_ = uVar116;
      auVar165._8_4_ = uVar116;
      auVar165._12_4_ = uVar116;
      auVar219 = vshufps_avx(auVar186,auVar186,0x55);
      auVar186 = vshufps_avx(auVar186,auVar186,0xaa);
      aVar3 = (local_5c8->vx).field_0;
      aVar4 = (local_5c8->vy).field_0;
      fVar162 = (local_5c8->vz).field_0.m128[0];
      fVar134 = *(float *)((long)&(local_5c8->vz).field_0 + 4);
      fVar205 = *(float *)((long)&(local_5c8->vz).field_0 + 8);
      fVar206 = *(float *)((long)&(local_5c8->vz).field_0 + 0xc);
      auVar217._0_4_ = fVar162 * auVar186._0_4_;
      auVar217._4_4_ = fVar134 * auVar186._4_4_;
      auVar217._8_4_ = fVar205 * auVar186._8_4_;
      auVar217._12_4_ = fVar206 * auVar186._12_4_;
      auVar219 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar4,auVar219);
      auVar8 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar3,auVar165);
      auVar219 = vblendps_avx(auVar8,auVar7,8);
      auVar5 = vsubps_avx(local_710,auVar6);
      uVar116 = auVar5._0_4_;
      auVar183._4_4_ = uVar116;
      auVar183._0_4_ = uVar116;
      auVar183._8_4_ = uVar116;
      auVar183._12_4_ = uVar116;
      auVar186 = vshufps_avx(auVar5,auVar5,0x55);
      auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
      auVar218._0_4_ = fVar162 * auVar5._0_4_;
      auVar218._4_4_ = fVar134 * auVar5._4_4_;
      auVar218._8_4_ = fVar205 * auVar5._8_4_;
      auVar218._12_4_ = fVar206 * auVar5._12_4_;
      auVar186 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar4,auVar186);
      auVar9 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar3,auVar183);
      auVar186 = vblendps_avx(auVar9,local_710,8);
      auVar202 = vsubps_avx(local_720,auVar6);
      uVar116 = auVar202._0_4_;
      auVar203._4_4_ = uVar116;
      auVar203._0_4_ = uVar116;
      auVar203._8_4_ = uVar116;
      auVar203._12_4_ = uVar116;
      auVar5 = vshufps_avx(auVar202,auVar202,0x55);
      auVar202 = vshufps_avx(auVar202,auVar202,0xaa);
      auVar225._0_4_ = fVar162 * auVar202._0_4_;
      auVar225._4_4_ = fVar134 * auVar202._4_4_;
      auVar225._8_4_ = fVar205 * auVar202._8_4_;
      auVar225._12_4_ = fVar206 * auVar202._12_4_;
      auVar5 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar4,auVar5);
      auVar10 = vfmadd231ps_fma(auVar5,(undefined1  [16])aVar3,auVar203);
      auVar5 = vblendps_avx(auVar10,local_720,8);
      auVar202 = vsubps_avx(_local_700,auVar6);
      uVar116 = auVar202._0_4_;
      auVar204._4_4_ = uVar116;
      auVar204._0_4_ = uVar116;
      auVar204._8_4_ = uVar116;
      auVar204._12_4_ = uVar116;
      auVar6 = vshufps_avx(auVar202,auVar202,0x55);
      auVar202 = vshufps_avx(auVar202,auVar202,0xaa);
      auVar230._0_4_ = fVar162 * auVar202._0_4_;
      auVar230._4_4_ = fVar134 * auVar202._4_4_;
      auVar230._8_4_ = fVar205 * auVar202._8_4_;
      auVar230._12_4_ = fVar206 * auVar202._12_4_;
      auVar6 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar4,auVar6);
      auVar118 = vfmadd231ps_fma(auVar6,(undefined1  [16])aVar3,auVar204);
      auVar6 = vblendps_avx(auVar118,_local_700,8);
      auVar23._4_4_ = uStack_1ac;
      auVar23._0_4_ = local_1b0;
      auVar23._8_4_ = uStack_1a8;
      auVar23._12_4_ = uStack_1a4;
      auVar219 = vandps_avx(auVar219,auVar23);
      auVar186 = vandps_avx(auVar186,auVar23);
      auVar202 = vmaxps_avx(auVar219,auVar186);
      auVar219 = vandps_avx(auVar5,auVar23);
      auVar186 = vandps_avx(auVar6,auVar23);
      auVar219 = vmaxps_avx(auVar219,auVar186);
      auVar219 = vmaxps_avx(auVar202,auVar219);
      auVar186 = vmovshdup_avx(auVar219);
      auVar186 = vmaxss_avx(auVar186,auVar219);
      auVar219 = vshufpd_avx(auVar219,auVar219,1);
      auVar219 = vmaxss_avx(auVar219,auVar186);
      auVar186 = vmovshdup_avx(auVar8);
      uVar117 = auVar186._0_8_;
      local_4c0._8_8_ = uVar117;
      local_4c0._0_8_ = uVar117;
      local_4c0._16_8_ = uVar117;
      local_4c0._24_8_ = uVar117;
      auVar5 = vmovshdup_avx(auVar9);
      uVar117 = auVar5._0_8_;
      local_4a0._8_8_ = uVar117;
      local_4a0._0_8_ = uVar117;
      local_4a0._16_8_ = uVar117;
      local_4a0._24_8_ = uVar117;
      auVar147 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x908);
      uVar224 = auVar10._0_4_;
      local_6e0._4_4_ = uVar224;
      local_6e0._0_4_ = uVar224;
      local_6e0._8_4_ = uVar224;
      local_6e0._12_4_ = uVar224;
      local_6e0._16_4_ = uVar224;
      local_6e0._20_4_ = uVar224;
      local_6e0._24_4_ = uVar224;
      local_6e0._28_4_ = uVar224;
      auVar5 = vmovshdup_avx(auVar10);
      uVar117 = auVar5._0_8_;
      local_820._8_8_ = uVar117;
      local_820._0_8_ = uVar117;
      local_820._16_8_ = uVar117;
      local_820._24_8_ = uVar117;
      fVar162 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar22 + 0xd8c);
      auVar107 = *(undefined1 (*) [28])(bezier_basis0 + lVar22 + 0xd8c);
      auVar5 = vmovshdup_avx(auVar118);
      local_840 = auVar5._0_8_;
      fVar228 = auVar118._0_4_;
      auVar148._0_4_ = fVar228 * fVar162;
      auVar148._4_4_ = fVar228 * *(float *)(bezier_basis0 + lVar22 + 0xd90);
      auVar148._8_4_ = fVar228 * *(float *)(bezier_basis0 + lVar22 + 0xd94);
      auVar148._12_4_ = fVar228 * *(float *)(bezier_basis0 + lVar22 + 0xd98);
      auVar148._16_4_ = fVar228 * *(float *)(bezier_basis0 + lVar22 + 0xd9c);
      auVar148._20_4_ = fVar228 * *(float *)(bezier_basis0 + lVar22 + 0xda0);
      auVar148._24_4_ = fVar228 * *(float *)(bezier_basis0 + lVar22 + 0xda4);
      auVar148._28_4_ = 0;
      auVar6 = vfmadd231ps_fma(auVar148,auVar147,local_6e0);
      fVar242 = auVar5._0_4_;
      fVar244 = auVar5._4_4_;
      auVar130._4_4_ = fVar244 * *(float *)(bezier_basis0 + lVar22 + 0xd90);
      auVar130._0_4_ = fVar242 * fVar162;
      auVar130._8_4_ = fVar242 * *(float *)(bezier_basis0 + lVar22 + 0xd94);
      auVar130._12_4_ = fVar244 * *(float *)(bezier_basis0 + lVar22 + 0xd98);
      auVar130._16_4_ = fVar242 * *(float *)(bezier_basis0 + lVar22 + 0xd9c);
      auVar130._20_4_ = fVar244 * *(float *)(bezier_basis0 + lVar22 + 0xda0);
      auVar130._24_4_ = fVar242 * *(float *)(bezier_basis0 + lVar22 + 0xda4);
      auVar130._28_4_ = *(undefined4 *)(bezier_basis0 + lVar22 + 0xda8);
      auVar5 = vfmadd231ps_fma(auVar130,auVar147,local_820);
      auVar130 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x484);
      uVar116 = auVar9._0_4_;
      local_860._4_4_ = uVar116;
      local_860._0_4_ = uVar116;
      local_860._8_4_ = uVar116;
      local_860._12_4_ = uVar116;
      local_860._16_4_ = uVar116;
      local_860._20_4_ = uVar116;
      local_860._24_4_ = uVar116;
      local_860._28_4_ = uVar116;
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar130,local_860);
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar130,local_4a0);
      auVar20 = *(undefined1 (*) [32])(bezier_basis0 + lVar22);
      uVar116 = auVar8._0_4_;
      local_780._4_4_ = uVar116;
      local_780._0_4_ = uVar116;
      local_780._8_4_ = uVar116;
      local_780._12_4_ = uVar116;
      local_780._16_4_ = uVar116;
      local_780._20_4_ = uVar116;
      local_780._24_4_ = uVar116;
      local_780._28_4_ = uVar116;
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar20,local_780);
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar20,local_4c0);
      auVar128 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x908);
      fVar161 = *(float *)(bezier_basis1 + lVar22 + 0xd8c);
      fVar135 = *(float *)(bezier_basis1 + lVar22 + 0xd90);
      fVar136 = *(float *)(bezier_basis1 + lVar22 + 0xd94);
      fVar137 = *(float *)(bezier_basis1 + lVar22 + 0xd98);
      fVar138 = *(float *)(bezier_basis1 + lVar22 + 0xd9c);
      fVar139 = *(float *)(bezier_basis1 + lVar22 + 0xda0);
      fVar140 = *(float *)(bezier_basis1 + lVar22 + 0xda4);
      auVar24._4_4_ = fVar135 * fVar228;
      auVar24._0_4_ = fVar161 * fVar228;
      auVar24._8_4_ = fVar136 * fVar228;
      auVar24._12_4_ = fVar137 * fVar228;
      auVar24._16_4_ = fVar138 * fVar228;
      auVar24._20_4_ = fVar139 * fVar228;
      auVar24._24_4_ = fVar140 * fVar228;
      auVar24._28_4_ = fVar228;
      auVar202 = vfmadd231ps_fma(auVar24,auVar128,local_6e0);
      auVar25._4_4_ = fVar244 * fVar135;
      auVar25._0_4_ = fVar242 * fVar161;
      auVar25._8_4_ = fVar242 * fVar136;
      auVar25._12_4_ = fVar244 * fVar137;
      auVar25._16_4_ = fVar242 * fVar138;
      auVar25._20_4_ = fVar244 * fVar139;
      auVar25._24_4_ = fVar242 * fVar140;
      auVar25._28_4_ = uVar224;
      auVar163 = vfmadd231ps_fma(auVar25,auVar128,local_820);
      auVar131 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x484);
      auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar131,local_860);
      auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),auVar131,local_4a0);
      auVar178 = *(undefined1 (*) [32])(bezier_basis1 + lVar22);
      auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar178,local_780);
      auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),auVar178,local_4c0);
      auVar120 = ZEXT1632(auVar202);
      auVar149 = ZEXT1632(auVar6);
      auVar21 = vsubps_avx(auVar120,auVar149);
      local_4e0 = ZEXT1632(auVar163);
      local_500 = ZEXT1632(auVar5);
      local_200 = vsubps_avx(local_4e0,local_500);
      auVar121._0_4_ = auVar21._0_4_ * auVar5._0_4_;
      auVar121._4_4_ = auVar21._4_4_ * auVar5._4_4_;
      auVar121._8_4_ = auVar21._8_4_ * auVar5._8_4_;
      auVar121._12_4_ = auVar21._12_4_ * auVar5._12_4_;
      auVar121._16_4_ = auVar21._16_4_ * 0.0;
      auVar121._20_4_ = auVar21._20_4_ * 0.0;
      auVar121._24_4_ = auVar21._24_4_ * 0.0;
      auVar121._28_4_ = 0;
      fVar162 = local_200._0_4_;
      auVar150._0_4_ = auVar6._0_4_ * fVar162;
      fVar134 = local_200._4_4_;
      auVar150._4_4_ = auVar6._4_4_ * fVar134;
      fVar205 = local_200._8_4_;
      auVar150._8_4_ = auVar6._8_4_ * fVar205;
      fVar206 = local_200._12_4_;
      auVar150._12_4_ = auVar6._12_4_ * fVar206;
      fVar207 = local_200._16_4_;
      auVar150._16_4_ = fVar207 * 0.0;
      fVar208 = local_200._20_4_;
      auVar150._20_4_ = fVar208 * 0.0;
      fVar209 = local_200._24_4_;
      auVar150._24_4_ = fVar209 * 0.0;
      auVar150._28_4_ = 0;
      auVar213 = vsubps_avx(auVar121,auVar150);
      auVar5 = vpermilps_avx(auVar7,0xff);
      uVar117 = auVar5._0_8_;
      local_a0._8_8_ = uVar117;
      local_a0._0_8_ = uVar117;
      local_a0._16_8_ = uVar117;
      local_a0._24_8_ = uVar117;
      auVar6 = vpermilps_avx(local_710,0xff);
      uVar117 = auVar6._0_8_;
      local_660._8_8_ = uVar117;
      local_660._0_8_ = uVar117;
      local_660._16_8_ = uVar117;
      local_660._24_8_ = uVar117;
      auVar202 = vpermilps_avx(local_720,0xff);
      uVar117 = auVar202._0_8_;
      local_c0._8_8_ = uVar117;
      local_c0._0_8_ = uVar117;
      local_c0._16_8_ = uVar117;
      local_c0._24_8_ = uVar117;
      auVar202 = vpermilps_avx(_local_700,0xff);
      local_e0 = auVar202._0_8_;
      local_8e0 = auVar107._0_4_;
      fStack_8dc = auVar107._4_4_;
      fStack_8d8 = auVar107._8_4_;
      fStack_8d4 = auVar107._12_4_;
      fStack_8d0 = auVar107._16_4_;
      fStack_8cc = auVar107._20_4_;
      fStack_8c8 = auVar107._24_4_;
      fVar141 = auVar202._0_4_;
      fVar160 = auVar202._4_4_;
      auVar26._4_4_ = fVar160 * fStack_8dc;
      auVar26._0_4_ = fVar141 * local_8e0;
      auVar26._8_4_ = fVar141 * fStack_8d8;
      auVar26._12_4_ = fVar160 * fStack_8d4;
      auVar26._16_4_ = fVar141 * fStack_8d0;
      auVar26._20_4_ = fVar160 * fStack_8cc;
      auVar26._24_4_ = fVar141 * fStack_8c8;
      auVar26._28_4_ = auVar213._28_4_;
      auVar202 = vfmadd231ps_fma(auVar26,local_c0,auVar147);
      auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar130,local_660);
      auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar20,local_a0);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar27._4_4_ = fVar135 * fVar160;
      auVar27._0_4_ = fVar161 * fVar141;
      auVar27._8_4_ = fVar136 * fVar141;
      auVar27._12_4_ = fVar137 * fVar160;
      auVar27._16_4_ = fVar138 * fVar141;
      auVar27._20_4_ = fVar139 * fVar160;
      auVar27._24_4_ = fVar140 * fVar141;
      auVar27._28_4_ = auVar186._4_4_;
      auVar186 = vfmadd231ps_fma(auVar27,auVar128,local_c0);
      auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar131,local_660);
      auVar163 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar178,local_a0);
      auVar28._4_4_ = fVar134 * fVar134;
      auVar28._0_4_ = fVar162 * fVar162;
      auVar28._8_4_ = fVar205 * fVar205;
      auVar28._12_4_ = fVar206 * fVar206;
      auVar28._16_4_ = fVar207 * fVar207;
      auVar28._20_4_ = fVar208 * fVar208;
      auVar28._24_4_ = fVar209 * fVar209;
      auVar28._28_4_ = auVar5._4_4_;
      auVar186 = vfmadd231ps_fma(auVar28,auVar21,auVar21);
      auVar122 = ZEXT1632(auVar202);
      auVar222 = vmaxps_avx(auVar122,ZEXT1632(auVar163));
      auVar29._4_4_ = auVar222._4_4_ * auVar222._4_4_ * auVar186._4_4_;
      auVar29._0_4_ = auVar222._0_4_ * auVar222._0_4_ * auVar186._0_4_;
      auVar29._8_4_ = auVar222._8_4_ * auVar222._8_4_ * auVar186._8_4_;
      auVar29._12_4_ = auVar222._12_4_ * auVar222._12_4_ * auVar186._12_4_;
      auVar29._16_4_ = auVar222._16_4_ * auVar222._16_4_ * 0.0;
      auVar29._20_4_ = auVar222._20_4_ * auVar222._20_4_ * 0.0;
      auVar29._24_4_ = auVar222._24_4_ * auVar222._24_4_ * 0.0;
      auVar29._28_4_ = auVar222._28_4_;
      local_6c0._0_4_ = auVar213._0_4_;
      local_6c0._4_4_ = auVar213._4_4_;
      auStack_6b8._0_4_ = auVar213._8_4_;
      auStack_6b8._4_4_ = auVar213._12_4_;
      auStack_6b0._0_4_ = auVar213._16_4_;
      auStack_6b0._4_4_ = auVar213._20_4_;
      fStack_6a8 = auVar213._24_4_;
      auVar30._4_4_ = (float)local_6c0._4_4_ * (float)local_6c0._4_4_;
      auVar30._0_4_ = (float)local_6c0._0_4_ * (float)local_6c0._0_4_;
      auVar30._8_4_ = (float)auStack_6b8._0_4_ * (float)auStack_6b8._0_4_;
      auVar30._12_4_ = (float)auStack_6b8._4_4_ * (float)auStack_6b8._4_4_;
      auVar30._16_4_ = (float)auStack_6b0._0_4_ * (float)auStack_6b0._0_4_;
      auVar30._20_4_ = (float)auStack_6b0._4_4_ * (float)auStack_6b0._4_4_;
      auVar30._24_4_ = fStack_6a8 * fStack_6a8;
      auVar30._28_4_ = auVar213._28_4_;
      auVar222 = vcmpps_avx(auVar30,auVar29,2);
      fVar162 = auVar219._0_4_ * 4.7683716e-07;
      auVar123._0_4_ = (float)iVar14;
      stack0xfffffffffffff944 = auVar118._4_12_;
      local_6c0._0_4_ = auVar123._0_4_;
      _auStack_6b0 = auVar213._16_16_;
      auVar123._4_4_ = auVar123._0_4_;
      auVar123._8_4_ = auVar123._0_4_;
      auVar123._12_4_ = auVar123._0_4_;
      auVar123._16_4_ = auVar123._0_4_;
      auVar123._20_4_ = auVar123._0_4_;
      auVar123._24_4_ = auVar123._0_4_;
      auVar123._28_4_ = auVar123._0_4_;
      auVar213 = vcmpps_avx(_DAT_02020f40,auVar123,1);
      auVar219 = vpermilps_avx(auVar8,0xaa);
      uVar117 = auVar219._0_8_;
      local_180._8_8_ = uVar117;
      local_180._0_8_ = uVar117;
      local_180._16_8_ = uVar117;
      local_180._24_8_ = uVar117;
      auVar219 = vpermilps_avx(auVar9,0xaa);
      uVar117 = auVar219._0_8_;
      local_460._8_8_ = uVar117;
      local_460._0_8_ = uVar117;
      local_460._16_8_ = uVar117;
      local_460._24_8_ = uVar117;
      auVar186 = vpermilps_avx(auVar10,0xaa);
      uVar117 = auVar186._0_8_;
      local_480._8_8_ = uVar117;
      local_480._0_8_ = uVar117;
      local_480._16_8_ = uVar117;
      local_480._24_8_ = uVar117;
      auVar219 = vshufps_avx(auVar118,auVar118,0xaa);
      uVar117 = auVar219._0_8_;
      auVar177 = auVar213 & auVar222;
      uVar111 = *(uint *)(ray + k * 4 + 0x30);
      local_680._0_16_ = ZEXT416(uVar111);
      local_890 = auVar7._0_8_;
      uStack_888 = auVar7._8_8_;
      auVar176 = local_640;
      fVar134 = fVar228;
      fVar205 = fVar228;
      fVar206 = fVar228;
      fVar207 = fVar228;
      fVar208 = fVar228;
      fVar209 = fVar228;
      fVar141 = fVar242;
      fVar160 = fVar244;
      fVar245 = fVar242;
      fVar246 = fVar244;
      fVar247 = fVar242;
      fVar248 = fVar244;
      uVar234 = uVar117;
      uVar235 = uVar117;
      uVar236 = uVar117;
      uStack_838 = local_840;
      uStack_830 = local_840;
      uStack_828 = local_840;
      local_760 = fVar228;
      fStack_75c = fVar228;
      fStack_758 = fVar228;
      fStack_754 = fVar228;
      fStack_750 = fVar228;
      fStack_74c = fVar228;
      fStack_748 = fVar228;
      fStack_744 = fVar228;
      if ((((((((auVar177 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar177 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar177 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar177 >> 0x7f,0) == '\0') &&
            (auVar177 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar177 >> 0xbf,0) == '\0') &&
          (auVar177 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar177[0x1f]) {
LAB_019911e2:
        auVar251 = ZEXT3264(local_860);
        auVar241 = ZEXT3264(local_660);
        auVar227 = ZEXT3264(local_820);
        auVar216 = ZEXT3264(local_780);
        auVar147 = local_620;
      }
      else {
        local_220 = vandps_avx(auVar222,auVar213);
        fVar229 = auVar219._0_4_;
        fVar233 = auVar219._4_4_;
        auVar31._4_4_ = fVar233 * fVar135;
        auVar31._0_4_ = fVar229 * fVar161;
        auVar31._8_4_ = fVar229 * fVar136;
        auVar31._12_4_ = fVar233 * fVar137;
        auVar31._16_4_ = fVar229 * fVar138;
        auVar31._20_4_ = fVar233 * fVar139;
        auVar31._24_4_ = fVar229 * fVar140;
        auVar31._28_4_ = local_220._28_4_;
        auVar219 = vfmadd213ps_fma(auVar128,local_480,auVar31);
        auVar219 = vfmadd213ps_fma(auVar131,local_460,ZEXT1632(auVar219));
        auVar219 = vfmadd213ps_fma(auVar178,local_180,ZEXT1632(auVar219));
        auVar124._0_4_ = fVar229 * local_8e0;
        auVar124._4_4_ = fVar233 * fStack_8dc;
        auVar124._8_4_ = fVar229 * fStack_8d8;
        auVar124._12_4_ = fVar233 * fStack_8d4;
        auVar124._16_4_ = fVar229 * fStack_8d0;
        auVar124._20_4_ = fVar233 * fStack_8cc;
        auVar124._24_4_ = fVar229 * fStack_8c8;
        auVar124._28_4_ = 0;
        auVar5 = vfmadd213ps_fma(auVar147,local_480,auVar124);
        auVar5 = vfmadd213ps_fma(auVar130,local_460,ZEXT1632(auVar5));
        auVar147 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1210);
        auVar130 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1694);
        auVar128 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1b18);
        fVar161 = *(float *)(bezier_basis0 + lVar22 + 0x1f9c);
        fVar135 = *(float *)(bezier_basis0 + lVar22 + 0x1fa0);
        fVar136 = *(float *)(bezier_basis0 + lVar22 + 0x1fa4);
        fVar137 = *(float *)(bezier_basis0 + lVar22 + 0x1fa8);
        fVar138 = *(float *)(bezier_basis0 + lVar22 + 0x1fac);
        fVar139 = *(float *)(bezier_basis0 + lVar22 + 0x1fb0);
        fVar140 = *(float *)(bezier_basis0 + lVar22 + 0x1fb4);
        auVar32._4_4_ = fVar228 * fVar135;
        auVar32._0_4_ = fVar228 * fVar161;
        auVar32._8_4_ = fVar228 * fVar136;
        auVar32._12_4_ = fVar228 * fVar137;
        auVar32._16_4_ = fVar228 * fVar138;
        auVar32._20_4_ = fVar228 * fVar139;
        auVar32._24_4_ = fVar228 * fVar140;
        auVar32._28_4_ = auVar6._4_4_;
        auVar33._4_4_ = fVar244 * fVar135;
        auVar33._0_4_ = fVar242 * fVar161;
        auVar33._8_4_ = fVar242 * fVar136;
        auVar33._12_4_ = fVar244 * fVar137;
        auVar33._16_4_ = fVar242 * fVar138;
        auVar33._20_4_ = fVar244 * fVar139;
        auVar33._24_4_ = fVar242 * fVar140;
        auVar33._28_4_ = auVar21._28_4_;
        auVar34._4_4_ = fVar135 * fVar233;
        auVar34._0_4_ = fVar161 * fVar229;
        auVar34._8_4_ = fVar136 * fVar229;
        auVar34._12_4_ = fVar137 * fVar233;
        auVar34._16_4_ = fVar138 * fVar229;
        auVar34._20_4_ = fVar139 * fVar233;
        auVar34._24_4_ = fVar140 * fVar229;
        auVar34._28_4_ = auVar186._4_4_;
        auVar186 = vfmadd231ps_fma(auVar32,auVar128,local_6e0);
        auVar6 = vfmadd231ps_fma(auVar33,auVar128,local_820);
        auVar202 = vfmadd231ps_fma(auVar34,local_480,auVar128);
        auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar130,local_860);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar130,local_4a0);
        auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),local_460,auVar130);
        auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar147,local_780);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar147,local_4c0);
        auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),local_180,auVar147);
        fVar161 = *(float *)(bezier_basis1 + lVar22 + 0x1f9c);
        fVar135 = *(float *)(bezier_basis1 + lVar22 + 0x1fa0);
        fVar136 = *(float *)(bezier_basis1 + lVar22 + 0x1fa4);
        fVar137 = *(float *)(bezier_basis1 + lVar22 + 0x1fa8);
        fVar138 = *(float *)(bezier_basis1 + lVar22 + 0x1fac);
        fVar139 = *(float *)(bezier_basis1 + lVar22 + 0x1fb0);
        fVar140 = *(float *)(bezier_basis1 + lVar22 + 0x1fb4);
        auVar35._4_4_ = fVar228 * fVar135;
        auVar35._0_4_ = fVar228 * fVar161;
        auVar35._8_4_ = fVar228 * fVar136;
        auVar35._12_4_ = fVar228 * fVar137;
        auVar35._16_4_ = fVar228 * fVar138;
        auVar35._20_4_ = fVar228 * fVar139;
        auVar35._24_4_ = fVar228 * fVar140;
        auVar35._28_4_ = fVar228;
        auVar36._4_4_ = fVar244 * fVar135;
        auVar36._0_4_ = fVar242 * fVar161;
        auVar36._8_4_ = fVar242 * fVar136;
        auVar36._12_4_ = fVar244 * fVar137;
        auVar36._16_4_ = fVar242 * fVar138;
        auVar36._20_4_ = fVar244 * fVar139;
        auVar36._24_4_ = fVar242 * fVar140;
        auVar36._28_4_ = fVar244;
        auVar37._4_4_ = fVar233 * fVar135;
        auVar37._0_4_ = fVar229 * fVar161;
        auVar37._8_4_ = fVar229 * fVar136;
        auVar37._12_4_ = fVar233 * fVar137;
        auVar37._16_4_ = fVar229 * fVar138;
        auVar37._20_4_ = fVar233 * fVar139;
        auVar37._24_4_ = fVar229 * fVar140;
        auVar37._28_4_ = fVar233;
        auVar147 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1b18);
        auVar8 = vfmadd231ps_fma(auVar35,auVar147,local_6e0);
        auVar9 = vfmadd231ps_fma(auVar36,auVar147,local_820);
        auVar10 = vfmadd231ps_fma(auVar37,auVar147,local_480);
        auVar147 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1694);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar147,local_860);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar147,local_4a0);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar147,local_460);
        auVar147 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1210);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar147,local_780);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar147,local_4c0);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),local_180,auVar147);
        auVar147 = vandps_avx(local_1a0,ZEXT1632(auVar186));
        auVar130 = vandps_avx(ZEXT1632(auVar6),local_1a0);
        auVar130 = vmaxps_avx(auVar147,auVar130);
        auVar147 = vandps_avx(ZEXT1632(auVar202),local_1a0);
        auVar147 = vmaxps_avx(auVar130,auVar147);
        auVar151._4_4_ = fVar162;
        auVar151._0_4_ = fVar162;
        auVar151._8_4_ = fVar162;
        auVar151._12_4_ = fVar162;
        auVar151._16_4_ = fVar162;
        auVar151._20_4_ = fVar162;
        auVar151._24_4_ = fVar162;
        auVar151._28_4_ = fVar162;
        auVar147 = vcmpps_avx(auVar147,auVar151,1);
        auVar128 = vblendvps_avx(ZEXT1632(auVar186),auVar21,auVar147);
        auVar131 = vblendvps_avx(ZEXT1632(auVar6),local_200,auVar147);
        auVar147 = vandps_avx(ZEXT1632(auVar8),local_1a0);
        auVar130 = vandps_avx(ZEXT1632(auVar9),local_1a0);
        auVar130 = vmaxps_avx(auVar147,auVar130);
        auVar147 = vandps_avx(ZEXT1632(auVar10),local_1a0);
        auVar147 = vmaxps_avx(auVar130,auVar147);
        auVar130 = vcmpps_avx(auVar147,auVar151,1);
        auVar147 = vblendvps_avx(ZEXT1632(auVar8),auVar21,auVar130);
        auVar130 = vblendvps_avx(ZEXT1632(auVar9),local_200,auVar130);
        auVar186 = vfmadd213ps_fma(auVar20,local_180,ZEXT1632(auVar5));
        auVar5 = vfmadd213ps_fma(auVar128,auVar128,ZEXT832(0) << 0x20);
        auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar131,auVar131);
        auVar178 = vrsqrtps_avx(ZEXT1632(auVar5));
        fVar161 = auVar178._0_4_;
        fVar135 = auVar178._4_4_;
        fVar136 = auVar178._8_4_;
        fVar137 = auVar178._12_4_;
        fVar138 = auVar178._16_4_;
        fVar139 = auVar178._20_4_;
        fVar140 = auVar178._24_4_;
        auVar38._4_4_ = fVar135 * fVar135 * fVar135 * auVar5._4_4_ * -0.5;
        auVar38._0_4_ = fVar161 * fVar161 * fVar161 * auVar5._0_4_ * -0.5;
        auVar38._8_4_ = fVar136 * fVar136 * fVar136 * auVar5._8_4_ * -0.5;
        auVar38._12_4_ = fVar137 * fVar137 * fVar137 * auVar5._12_4_ * -0.5;
        auVar38._16_4_ = fVar138 * fVar138 * fVar138 * -0.0;
        auVar38._20_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar38._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
        auVar38._28_4_ = 0;
        auVar239._8_4_ = 0x3fc00000;
        auVar239._0_8_ = 0x3fc000003fc00000;
        auVar239._12_4_ = 0x3fc00000;
        auVar239._16_4_ = 0x3fc00000;
        auVar239._20_4_ = 0x3fc00000;
        auVar239._24_4_ = 0x3fc00000;
        auVar239._28_4_ = 0x3fc00000;
        auVar5 = vfmadd231ps_fma(auVar38,auVar239,auVar178);
        fVar161 = auVar5._0_4_;
        fVar135 = auVar5._4_4_;
        auVar39._4_4_ = auVar131._4_4_ * fVar135;
        auVar39._0_4_ = auVar131._0_4_ * fVar161;
        fVar136 = auVar5._8_4_;
        auVar39._8_4_ = auVar131._8_4_ * fVar136;
        fVar137 = auVar5._12_4_;
        auVar39._12_4_ = auVar131._12_4_ * fVar137;
        auVar39._16_4_ = auVar131._16_4_ * 0.0;
        auVar39._20_4_ = auVar131._20_4_ * 0.0;
        auVar39._24_4_ = auVar131._24_4_ * 0.0;
        auVar39._28_4_ = auVar178._28_4_;
        auVar40._4_4_ = -auVar128._4_4_ * fVar135;
        auVar40._0_4_ = -auVar128._0_4_ * fVar161;
        auVar40._8_4_ = -auVar128._8_4_ * fVar136;
        auVar40._12_4_ = -auVar128._12_4_ * fVar137;
        auVar40._16_4_ = -auVar128._16_4_ * 0.0;
        auVar40._20_4_ = -auVar128._20_4_ * 0.0;
        auVar40._24_4_ = -auVar128._24_4_ * 0.0;
        auVar40._28_4_ = 0;
        auVar5 = vfmadd213ps_fma(auVar147,auVar147,ZEXT832(0) << 0x20);
        auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar130,auVar130);
        auVar128 = vrsqrtps_avx(ZEXT1632(auVar5));
        auVar131 = ZEXT1632(CONCAT412(fVar137 * 0.0,
                                      CONCAT48(fVar136 * 0.0,CONCAT44(fVar135 * 0.0,fVar161 * 0.0)))
                           );
        fVar161 = auVar128._0_4_;
        fVar135 = auVar128._4_4_;
        fVar136 = auVar128._8_4_;
        fVar137 = auVar128._12_4_;
        fVar138 = auVar128._16_4_;
        fVar139 = auVar128._20_4_;
        fVar140 = auVar128._24_4_;
        auVar41._4_4_ = fVar135 * fVar135 * fVar135 * auVar5._4_4_ * -0.5;
        auVar41._0_4_ = fVar161 * fVar161 * fVar161 * auVar5._0_4_ * -0.5;
        auVar41._8_4_ = fVar136 * fVar136 * fVar136 * auVar5._8_4_ * -0.5;
        auVar41._12_4_ = fVar137 * fVar137 * fVar137 * auVar5._12_4_ * -0.5;
        auVar41._16_4_ = fVar138 * fVar138 * fVar138 * -0.0;
        auVar41._20_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar41._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
        auVar41._28_4_ = 0xbf000000;
        auVar5 = vfmadd231ps_fma(auVar41,auVar239,auVar128);
        fVar161 = auVar5._0_4_;
        fVar135 = auVar5._4_4_;
        auVar42._4_4_ = fVar135 * auVar130._4_4_;
        auVar42._0_4_ = fVar161 * auVar130._0_4_;
        fVar136 = auVar5._8_4_;
        auVar42._8_4_ = fVar136 * auVar130._8_4_;
        fVar137 = auVar5._12_4_;
        auVar42._12_4_ = fVar137 * auVar130._12_4_;
        auVar42._16_4_ = auVar130._16_4_ * 0.0;
        auVar42._20_4_ = auVar130._20_4_ * 0.0;
        auVar42._24_4_ = auVar130._24_4_ * 0.0;
        auVar42._28_4_ = 0;
        auVar43._4_4_ = fVar135 * -auVar147._4_4_;
        auVar43._0_4_ = fVar161 * -auVar147._0_4_;
        auVar43._8_4_ = fVar136 * -auVar147._8_4_;
        auVar43._12_4_ = fVar137 * -auVar147._12_4_;
        auVar43._16_4_ = -auVar147._16_4_ * 0.0;
        auVar43._20_4_ = -auVar147._20_4_ * 0.0;
        auVar43._24_4_ = -auVar147._24_4_ * 0.0;
        auVar43._28_4_ = 0x3fc00000;
        auVar44._28_4_ = auVar128._28_4_;
        auVar44._0_28_ =
             ZEXT1628(CONCAT412(fVar137 * 0.0,
                                CONCAT48(fVar136 * 0.0,CONCAT44(fVar135 * 0.0,fVar161 * 0.0))));
        auVar5 = vfmadd213ps_fma(auVar39,auVar122,auVar149);
        auVar6 = vfmadd213ps_fma(auVar40,auVar122,local_500);
        local_7e0._0_32_ = ZEXT1632(auVar6);
        auVar6 = vfmadd213ps_fma(auVar131,auVar122,ZEXT1632(auVar186));
        auVar10 = vfnmadd213ps_fma(auVar39,auVar122,auVar149);
        auVar202 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar163),auVar120);
        auVar118 = vfnmadd213ps_fma(auVar40,auVar122,local_500);
        auVar147 = ZEXT1632(auVar163);
        auVar8 = vfmadd213ps_fma(auVar43,auVar147,local_4e0);
        auVar142 = vfnmadd231ps_fma(ZEXT1632(auVar186),auVar122,auVar131);
        auVar186 = vfmadd213ps_fma(auVar44,auVar147,ZEXT1632(auVar219));
        auVar23 = vfnmadd213ps_fma(auVar42,auVar147,auVar120);
        auVar119 = vfnmadd213ps_fma(auVar43,auVar147,local_4e0);
        auVar143 = vfnmadd231ps_fma(ZEXT1632(auVar219),ZEXT1632(auVar163),auVar44);
        auVar147 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar118));
        auVar130 = vsubps_avx(ZEXT1632(auVar186),ZEXT1632(auVar142));
        auVar174._0_4_ = auVar147._0_4_ * auVar142._0_4_;
        auVar174._4_4_ = auVar147._4_4_ * auVar142._4_4_;
        auVar174._8_4_ = auVar147._8_4_ * auVar142._8_4_;
        auVar174._12_4_ = auVar147._12_4_ * auVar142._12_4_;
        auVar174._16_4_ = auVar147._16_4_ * 0.0;
        auVar174._20_4_ = auVar147._20_4_ * 0.0;
        auVar174._24_4_ = auVar147._24_4_ * 0.0;
        auVar174._28_4_ = 0;
        auVar9 = vfmsub231ps_fma(auVar174,ZEXT1632(auVar118),auVar130);
        auVar45._4_4_ = auVar10._4_4_ * auVar130._4_4_;
        auVar45._0_4_ = auVar10._0_4_ * auVar130._0_4_;
        auVar45._8_4_ = auVar10._8_4_ * auVar130._8_4_;
        auVar45._12_4_ = auVar10._12_4_ * auVar130._12_4_;
        auVar45._16_4_ = auVar130._16_4_ * 0.0;
        auVar45._20_4_ = auVar130._20_4_ * 0.0;
        auVar45._24_4_ = auVar130._24_4_ * 0.0;
        auVar45._28_4_ = auVar130._28_4_;
        auVar213 = ZEXT1632(auVar10);
        auVar130 = vsubps_avx(ZEXT1632(auVar202),auVar213);
        auVar177 = ZEXT1632(auVar142);
        auVar219 = vfmsub231ps_fma(auVar45,auVar177,auVar130);
        auVar46._4_4_ = auVar118._4_4_ * auVar130._4_4_;
        auVar46._0_4_ = auVar118._0_4_ * auVar130._0_4_;
        auVar46._8_4_ = auVar118._8_4_ * auVar130._8_4_;
        auVar46._12_4_ = auVar118._12_4_ * auVar130._12_4_;
        auVar46._16_4_ = auVar130._16_4_ * 0.0;
        auVar46._20_4_ = auVar130._20_4_ * 0.0;
        auVar46._24_4_ = auVar130._24_4_ * 0.0;
        auVar46._28_4_ = auVar130._28_4_;
        auVar10 = vfmsub231ps_fma(auVar46,auVar213,auVar147);
        auVar219 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar219));
        auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
        auVar176 = vcmpps_avx(ZEXT1632(auVar219),ZEXT832(0) << 0x20,2);
        auVar147 = vblendvps_avx(ZEXT1632(auVar23),ZEXT1632(auVar5),auVar176);
        auVar130 = vblendvps_avx(ZEXT1632(auVar119),local_7e0._0_32_,auVar176);
        auVar128 = vblendvps_avx(ZEXT1632(auVar143),ZEXT1632(auVar6),auVar176);
        auVar131 = vblendvps_avx(auVar213,ZEXT1632(auVar202),auVar176);
        auVar178 = vblendvps_avx(ZEXT1632(auVar118),ZEXT1632(auVar8),auVar176);
        auVar222 = vblendvps_avx(auVar177,ZEXT1632(auVar186),auVar176);
        auVar213 = vblendvps_avx(ZEXT1632(auVar202),auVar213,auVar176);
        auVar21 = vblendvps_avx(ZEXT1632(auVar8),ZEXT1632(auVar118),auVar176);
        auVar219 = vpackssdw_avx(local_220._0_16_,local_220._16_16_);
        auVar177 = vblendvps_avx(ZEXT1632(auVar186),auVar177,auVar176);
        auVar120 = vsubps_avx(auVar213,auVar147);
        auVar21 = vsubps_avx(auVar21,auVar130);
        auVar149 = vsubps_avx(auVar177,auVar128);
        auVar187 = vsubps_avx(auVar147,auVar131);
        auVar200 = vsubps_avx(auVar130,auVar178);
        auVar210 = vsubps_avx(auVar128,auVar222);
        auVar47._4_4_ = auVar149._4_4_ * auVar147._4_4_;
        auVar47._0_4_ = auVar149._0_4_ * auVar147._0_4_;
        auVar47._8_4_ = auVar149._8_4_ * auVar147._8_4_;
        auVar47._12_4_ = auVar149._12_4_ * auVar147._12_4_;
        auVar47._16_4_ = auVar149._16_4_ * auVar147._16_4_;
        auVar47._20_4_ = auVar149._20_4_ * auVar147._20_4_;
        auVar47._24_4_ = auVar149._24_4_ * auVar147._24_4_;
        auVar47._28_4_ = auVar177._28_4_;
        auVar186 = vfmsub231ps_fma(auVar47,auVar128,auVar120);
        auVar48._4_4_ = auVar120._4_4_ * auVar130._4_4_;
        auVar48._0_4_ = auVar120._0_4_ * auVar130._0_4_;
        auVar48._8_4_ = auVar120._8_4_ * auVar130._8_4_;
        auVar48._12_4_ = auVar120._12_4_ * auVar130._12_4_;
        auVar48._16_4_ = auVar120._16_4_ * auVar130._16_4_;
        auVar48._20_4_ = auVar120._20_4_ * auVar130._20_4_;
        auVar48._24_4_ = auVar120._24_4_ * auVar130._24_4_;
        auVar48._28_4_ = auVar213._28_4_;
        auVar5 = vfmsub231ps_fma(auVar48,auVar147,auVar21);
        auVar186 = vfmadd231ps_fma(ZEXT1632(auVar5),ZEXT832(0) << 0x20,ZEXT1632(auVar186));
        auVar125._0_4_ = auVar21._0_4_ * auVar128._0_4_;
        auVar125._4_4_ = auVar21._4_4_ * auVar128._4_4_;
        auVar125._8_4_ = auVar21._8_4_ * auVar128._8_4_;
        auVar125._12_4_ = auVar21._12_4_ * auVar128._12_4_;
        auVar125._16_4_ = auVar21._16_4_ * auVar128._16_4_;
        auVar125._20_4_ = auVar21._20_4_ * auVar128._20_4_;
        auVar125._24_4_ = auVar21._24_4_ * auVar128._24_4_;
        auVar125._28_4_ = 0;
        auVar5 = vfmsub231ps_fma(auVar125,auVar130,auVar149);
        auVar5 = vfmadd231ps_fma(ZEXT1632(auVar186),ZEXT832(0) << 0x20,ZEXT1632(auVar5));
        auVar126._0_4_ = auVar210._0_4_ * auVar131._0_4_;
        auVar126._4_4_ = auVar210._4_4_ * auVar131._4_4_;
        auVar126._8_4_ = auVar210._8_4_ * auVar131._8_4_;
        auVar126._12_4_ = auVar210._12_4_ * auVar131._12_4_;
        auVar126._16_4_ = auVar210._16_4_ * auVar131._16_4_;
        auVar126._20_4_ = auVar210._20_4_ * auVar131._20_4_;
        auVar126._24_4_ = auVar210._24_4_ * auVar131._24_4_;
        auVar126._28_4_ = 0;
        auVar186 = vfmsub231ps_fma(auVar126,auVar187,auVar222);
        auVar49._4_4_ = auVar200._4_4_ * auVar222._4_4_;
        auVar49._0_4_ = auVar200._0_4_ * auVar222._0_4_;
        auVar49._8_4_ = auVar200._8_4_ * auVar222._8_4_;
        auVar49._12_4_ = auVar200._12_4_ * auVar222._12_4_;
        auVar49._16_4_ = auVar200._16_4_ * auVar222._16_4_;
        auVar49._20_4_ = auVar200._20_4_ * auVar222._20_4_;
        auVar49._24_4_ = auVar200._24_4_ * auVar222._24_4_;
        auVar49._28_4_ = auVar222._28_4_;
        auVar6 = vfmsub231ps_fma(auVar49,auVar178,auVar210);
        auVar50._4_4_ = auVar187._4_4_ * auVar178._4_4_;
        auVar50._0_4_ = auVar187._0_4_ * auVar178._0_4_;
        auVar50._8_4_ = auVar187._8_4_ * auVar178._8_4_;
        auVar50._12_4_ = auVar187._12_4_ * auVar178._12_4_;
        auVar50._16_4_ = auVar187._16_4_ * auVar178._16_4_;
        auVar50._20_4_ = auVar187._20_4_ * auVar178._20_4_;
        auVar50._24_4_ = auVar187._24_4_ * auVar178._24_4_;
        auVar50._28_4_ = auVar178._28_4_;
        auVar202 = vfmsub231ps_fma(auVar50,auVar200,auVar131);
        auVar186 = vfmadd231ps_fma(ZEXT1632(auVar202),ZEXT832(0) << 0x20,ZEXT1632(auVar186));
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar186),ZEXT832(0) << 0x20,ZEXT1632(auVar6));
        auVar131 = vmaxps_avx(ZEXT1632(auVar5),ZEXT1632(auVar6));
        auVar131 = vcmpps_avx(auVar131,ZEXT832(0) << 0x20,2);
        auVar186 = vpackssdw_avx(auVar131._0_16_,auVar131._16_16_);
        auVar219 = vpand_avx(auVar219,auVar186);
        auVar131 = vpmovsxwd_avx2(auVar219);
        if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar131 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar131 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar131 >> 0x7f,0) == '\0') &&
              (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar131 >> 0xbf,0) == '\0') &&
            (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar131[0x1f]) {
LAB_0199257f:
          auVar216 = ZEXT3264(CONCAT824(uStack_5a8,
                                        CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
          auVar223 = ZEXT3264(local_620);
          auVar180 = ZEXT3264(local_640);
        }
        else {
          auVar51._4_4_ = auVar21._4_4_ * auVar210._4_4_;
          auVar51._0_4_ = auVar21._0_4_ * auVar210._0_4_;
          auVar51._8_4_ = auVar21._8_4_ * auVar210._8_4_;
          auVar51._12_4_ = auVar21._12_4_ * auVar210._12_4_;
          auVar51._16_4_ = auVar21._16_4_ * auVar210._16_4_;
          auVar51._20_4_ = auVar21._20_4_ * auVar210._20_4_;
          auVar51._24_4_ = auVar21._24_4_ * auVar210._24_4_;
          auVar51._28_4_ = auVar131._28_4_;
          auVar9 = vfmsub231ps_fma(auVar51,auVar200,auVar149);
          auVar152._0_4_ = auVar149._0_4_ * auVar187._0_4_;
          auVar152._4_4_ = auVar149._4_4_ * auVar187._4_4_;
          auVar152._8_4_ = auVar149._8_4_ * auVar187._8_4_;
          auVar152._12_4_ = auVar149._12_4_ * auVar187._12_4_;
          auVar152._16_4_ = auVar149._16_4_ * auVar187._16_4_;
          auVar152._20_4_ = auVar149._20_4_ * auVar187._20_4_;
          auVar152._24_4_ = auVar149._24_4_ * auVar187._24_4_;
          auVar152._28_4_ = 0;
          auVar8 = vfmsub231ps_fma(auVar152,auVar120,auVar210);
          auVar52._4_4_ = auVar120._4_4_ * auVar200._4_4_;
          auVar52._0_4_ = auVar120._0_4_ * auVar200._0_4_;
          auVar52._8_4_ = auVar120._8_4_ * auVar200._8_4_;
          auVar52._12_4_ = auVar120._12_4_ * auVar200._12_4_;
          auVar52._16_4_ = auVar120._16_4_ * auVar200._16_4_;
          auVar52._20_4_ = auVar120._20_4_ * auVar200._20_4_;
          auVar52._24_4_ = auVar120._24_4_ * auVar200._24_4_;
          auVar52._28_4_ = auVar120._28_4_;
          auVar10 = vfmsub231ps_fma(auVar52,auVar187,auVar21);
          auVar186 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar8),ZEXT1632(auVar10));
          auVar202 = vfmadd231ps_fma(ZEXT1632(auVar186),ZEXT1632(auVar9),_DAT_02020f00);
          auVar131 = vrcpps_avx(ZEXT1632(auVar202));
          auVar226._8_4_ = 0x3f800000;
          auVar226._0_8_ = &DAT_3f8000003f800000;
          auVar226._12_4_ = 0x3f800000;
          auVar226._16_4_ = 0x3f800000;
          auVar226._20_4_ = 0x3f800000;
          auVar226._24_4_ = 0x3f800000;
          auVar226._28_4_ = 0x3f800000;
          auVar186 = vfnmadd213ps_fma(auVar131,ZEXT1632(auVar202),auVar226);
          auVar186 = vfmadd132ps_fma(ZEXT1632(auVar186),auVar131,auVar131);
          auVar53._4_4_ = auVar10._4_4_ * auVar128._4_4_;
          auVar53._0_4_ = auVar10._0_4_ * auVar128._0_4_;
          auVar53._8_4_ = auVar10._8_4_ * auVar128._8_4_;
          auVar53._12_4_ = auVar10._12_4_ * auVar128._12_4_;
          auVar53._16_4_ = auVar128._16_4_ * 0.0;
          auVar53._20_4_ = auVar128._20_4_ * 0.0;
          auVar53._24_4_ = auVar128._24_4_ * 0.0;
          auVar53._28_4_ = auVar128._28_4_;
          auVar8 = vfmadd231ps_fma(auVar53,auVar130,ZEXT1632(auVar8));
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar9),auVar147);
          fVar161 = auVar186._0_4_;
          fVar135 = auVar186._4_4_;
          fVar136 = auVar186._8_4_;
          fVar137 = auVar186._12_4_;
          auVar54._28_4_ = auVar130._28_4_;
          auVar54._0_28_ =
               ZEXT1628(CONCAT412(fVar137 * auVar8._12_4_,
                                  CONCAT48(fVar136 * auVar8._8_4_,
                                           CONCAT44(fVar135 * auVar8._4_4_,fVar161 * auVar8._0_4_)))
                       );
          auVar127._4_4_ = uVar111;
          auVar127._0_4_ = uVar111;
          auVar127._8_4_ = uVar111;
          auVar127._12_4_ = uVar111;
          auVar127._16_4_ = uVar111;
          auVar127._20_4_ = uVar111;
          auVar127._24_4_ = uVar111;
          auVar127._28_4_ = uVar111;
          uVar116 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar153._4_4_ = uVar116;
          auVar153._0_4_ = uVar116;
          auVar153._8_4_ = uVar116;
          auVar153._12_4_ = uVar116;
          auVar153._16_4_ = uVar116;
          auVar153._20_4_ = uVar116;
          auVar153._24_4_ = uVar116;
          auVar153._28_4_ = uVar116;
          auVar147 = vcmpps_avx(auVar127,auVar54,2);
          auVar130 = vcmpps_avx(auVar54,auVar153,2);
          auVar147 = vandps_avx(auVar130,auVar147);
          auVar186 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
          auVar219 = vpand_avx(auVar219,auVar186);
          auVar147 = vpmovsxwd_avx2(auVar219);
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar147 >> 0x7f,0) == '\0') &&
                (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0xbf,0) == '\0') &&
              (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar147[0x1f]) goto LAB_0199257f;
          auVar147 = vcmpps_avx(ZEXT1632(auVar202),ZEXT832(0) << 0x20,4);
          auVar186 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
          auVar219 = vpand_avx(auVar219,auVar186);
          auVar147 = vpmovsxwd_avx2(auVar219);
          auVar216 = ZEXT3264(CONCAT824(uStack_5a8,
                                        CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
          auVar223 = ZEXT3264(local_620);
          auVar180 = ZEXT3264(local_640);
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar147 >> 0x7f,0) != '\0') ||
                (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0xbf,0) != '\0') ||
              (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar147[0x1f] < '\0') {
            auVar128 = ZEXT1632(CONCAT412(fVar137 * auVar5._12_4_,
                                          CONCAT48(fVar136 * auVar5._8_4_,
                                                   CONCAT44(fVar135 * auVar5._4_4_,
                                                            fVar161 * auVar5._0_4_))));
            auVar131 = ZEXT1632(CONCAT412(fVar137 * auVar6._12_4_,
                                          CONCAT48(fVar136 * auVar6._8_4_,
                                                   CONCAT44(fVar135 * auVar6._4_4_,
                                                            fVar161 * auVar6._0_4_))));
            auVar192._8_4_ = 0x3f800000;
            auVar192._0_8_ = &DAT_3f8000003f800000;
            auVar192._12_4_ = 0x3f800000;
            auVar192._16_4_ = 0x3f800000;
            auVar192._20_4_ = 0x3f800000;
            auVar192._24_4_ = 0x3f800000;
            auVar192._28_4_ = 0x3f800000;
            auVar130 = vsubps_avx(auVar192,auVar128);
            auVar130 = vblendvps_avx(auVar130,auVar128,auVar176);
            auVar223 = ZEXT3264(auVar130);
            auVar130 = vsubps_avx(auVar192,auVar131);
            local_240 = vblendvps_avx(auVar130,auVar131,auVar176);
            auVar216 = ZEXT3264(auVar147);
            auVar180 = ZEXT3264(auVar54);
          }
        }
        local_620 = auVar223._0_32_;
        auVar251 = ZEXT3264(local_860);
        auVar241 = ZEXT3264(local_660);
        auVar227 = ZEXT3264(local_820);
        auVar176 = auVar180._0_32_;
        auVar147 = auVar216._0_32_;
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0x7f,0) == '\0') &&
              (auVar216 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar147 >> 0xbf,0) == '\0') &&
            (auVar216 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar216[0x1f]) goto LAB_019911e2;
        auVar130 = vsubps_avx(ZEXT1632(auVar163),auVar122);
        auVar219 = vfmadd213ps_fma(auVar130,local_620,auVar122);
        fVar161 = *(float *)((long)local_868->ray_space + k * 4 + -0x10);
        auVar55._4_4_ = (auVar219._4_4_ + auVar219._4_4_) * fVar161;
        auVar55._0_4_ = (auVar219._0_4_ + auVar219._0_4_) * fVar161;
        auVar55._8_4_ = (auVar219._8_4_ + auVar219._8_4_) * fVar161;
        auVar55._12_4_ = (auVar219._12_4_ + auVar219._12_4_) * fVar161;
        auVar55._16_4_ = fVar161 * 0.0;
        auVar55._20_4_ = fVar161 * 0.0;
        auVar55._24_4_ = fVar161 * 0.0;
        auVar55._28_4_ = 0;
        auVar130 = vcmpps_avx(auVar176,auVar55,6);
        auVar128 = auVar147 & auVar130;
        auVar216 = ZEXT3264(local_780);
        if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar128 >> 0x7f,0) == '\0') &&
              (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar128 >> 0xbf,0) == '\0') &&
            (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar128[0x1f]) goto LAB_019911e2;
        local_2e0 = vandps_avx(auVar130,auVar147);
        auVar154._8_4_ = 0xbf800000;
        auVar154._0_8_ = 0xbf800000bf800000;
        auVar154._12_4_ = 0xbf800000;
        auVar154._16_4_ = 0xbf800000;
        auVar154._20_4_ = 0xbf800000;
        auVar154._24_4_ = 0xbf800000;
        auVar154._28_4_ = 0xbf800000;
        auVar175._8_4_ = 0x40000000;
        auVar175._0_8_ = 0x4000000040000000;
        auVar175._12_4_ = 0x40000000;
        auVar175._16_4_ = 0x40000000;
        auVar175._20_4_ = 0x40000000;
        auVar175._24_4_ = 0x40000000;
        auVar175._28_4_ = 0x40000000;
        auVar219 = vfmadd213ps_fma(local_240,auVar175,auVar154);
        local_3a0 = local_620;
        local_240 = ZEXT1632(auVar219);
        auVar147 = local_240;
        local_380 = ZEXT1632(auVar219);
        local_360 = auVar176;
        local_340 = 0;
        local_33c = iVar14;
        local_330 = local_890;
        uStack_328 = uStack_888;
        local_320 = local_710._0_8_;
        uStack_318 = local_710._8_8_;
        local_310 = local_720._0_8_;
        uStack_308 = local_720._8_8_;
        local_300 = local_700;
        uStack_2f8 = uStack_6f8;
        local_240 = auVar147;
        auVar147 = local_620;
        if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          fVar161 = 1.0 / auVar123._0_4_;
          local_2c0[0] = fVar161 * (auVar223._0_4_ + 0.0);
          local_2c0[1] = fVar161 * (auVar223._4_4_ + 1.0);
          local_2c0[2] = fVar161 * (auVar223._8_4_ + 2.0);
          local_2c0[3] = fVar161 * (auVar223._12_4_ + 3.0);
          fStack_2b0 = fVar161 * (auVar223._16_4_ + 4.0);
          fStack_2ac = fVar161 * (auVar223._20_4_ + 5.0);
          fStack_2a8 = fVar161 * (auVar223._24_4_ + 6.0);
          fStack_2a4 = auVar223._28_4_ + 7.0;
          local_240._0_8_ = auVar219._0_8_;
          local_240._8_8_ = auVar219._8_8_;
          local_2a0 = local_240._0_8_;
          uStack_298 = local_240._8_8_;
          uStack_290 = 0;
          uStack_288 = 0;
          local_280 = auVar176;
          auVar155._8_4_ = 0x7f800000;
          auVar155._0_8_ = 0x7f8000007f800000;
          auVar155._12_4_ = 0x7f800000;
          auVar155._16_4_ = 0x7f800000;
          auVar155._20_4_ = 0x7f800000;
          auVar155._24_4_ = 0x7f800000;
          auVar155._28_4_ = 0x7f800000;
          auVar130 = vblendvps_avx(auVar155,auVar176,local_2e0);
          auVar128 = vshufps_avx(auVar130,auVar130,0xb1);
          auVar128 = vminps_avx(auVar130,auVar128);
          auVar131 = vshufpd_avx(auVar128,auVar128,5);
          auVar128 = vminps_avx(auVar128,auVar131);
          auVar131 = vpermpd_avx2(auVar128,0x4e);
          auVar128 = vminps_avx(auVar128,auVar131);
          auVar128 = vcmpps_avx(auVar130,auVar128,0);
          auVar131 = local_2e0 & auVar128;
          auVar130 = local_2e0;
          if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar131 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar131 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar131 >> 0x7f,0) != '\0') ||
                (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar131 >> 0xbf,0) != '\0') ||
              (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar131[0x1f] < '\0') {
            auVar130 = vandps_avx(auVar128,local_2e0);
          }
          uVar109 = vmovmskps_avx(auVar130);
          uVar111 = 0;
          for (; (uVar109 & 1) == 0; uVar109 = uVar109 >> 1 | 0x80000000) {
            uVar111 = uVar111 + 1;
          }
          uVar110 = (ulong)uVar111;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar161 = local_2c0[uVar110];
            uVar116 = *(undefined4 *)((long)&local_2a0 + uVar110 * 4);
            fVar136 = 1.0 - fVar161;
            fVar135 = fVar136 * fVar136 * -3.0;
            auVar219 = vfmadd231ss_fma(ZEXT416((uint)(fVar136 * fVar136)),
                                       ZEXT416((uint)(fVar161 * fVar136)),ZEXT416(0xc0000000));
            auVar186 = vfmsub132ss_fma(ZEXT416((uint)(fVar161 * fVar136)),
                                       ZEXT416((uint)(fVar161 * fVar161)),ZEXT416(0x40000000));
            fVar136 = auVar219._0_4_ * 3.0;
            fVar137 = auVar186._0_4_ * 3.0;
            fVar138 = fVar161 * fVar161 * 3.0;
            auVar193._0_4_ = fVar138 * (float)local_700._0_4_;
            auVar193._4_4_ = fVar138 * (float)local_700._4_4_;
            auVar193._8_4_ = fVar138 * (float)uStack_6f8;
            auVar193._12_4_ = fVar138 * uStack_6f8._4_4_;
            auVar166._4_4_ = fVar137;
            auVar166._0_4_ = fVar137;
            auVar166._8_4_ = fVar137;
            auVar166._12_4_ = fVar137;
            auVar219 = vfmadd132ps_fma(auVar166,auVar193,local_720);
            auVar184._4_4_ = fVar136;
            auVar184._0_4_ = fVar136;
            auVar184._8_4_ = fVar136;
            auVar184._12_4_ = fVar136;
            auVar219 = vfmadd132ps_fma(auVar184,auVar219,local_710);
            auVar167._4_4_ = fVar135;
            auVar167._0_4_ = fVar135;
            auVar167._8_4_ = fVar135;
            auVar167._12_4_ = fVar135;
            auVar219 = vfmadd132ps_fma(auVar167,auVar219,auVar7);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar110 * 4);
            *(int *)(ray + k * 4 + 0xc0) = auVar219._0_4_;
            uVar224 = vextractps_avx(auVar219,1);
            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar224;
            uVar224 = vextractps_avx(auVar219,2);
            *(undefined4 *)(ray + k * 4 + 0xe0) = uVar224;
            *(float *)(ray + k * 4 + 0xf0) = fVar161;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar116;
            *(uint *)(ray + k * 4 + 0x110) = uVar13;
            *(uint *)(ray + k * 4 + 0x120) = uVar12;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
          else {
            local_800._0_16_ = CONCAT412(uVar12,CONCAT48(uVar12,CONCAT44(uVar12,uVar12)));
            local_800 = ZEXT1632(local_800._0_16_);
            local_740 = (undefined1  [8])CONCAT44(uVar13,uVar13);
            _local_740 = ZEXT1632(CONCAT412(uVar13,CONCAT48(uVar13,local_740)));
            local_5a0 = ZEXT1632(local_710);
            _auStack_530 = auVar20._16_16_;
            _local_540 = local_720;
            _local_560 = ZEXT1632(_local_700);
            local_580 = ZEXT1632(*local_6e8);
            local_6a0 = uVar117;
            uStack_698 = uVar117;
            uStack_690 = uVar117;
            uStack_688 = uVar117;
            local_640 = auVar176;
            local_600 = local_2e0;
            do {
              local_7e0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
              local_400 = local_2c0[uVar110];
              uVar116 = *(undefined4 *)((long)&local_2a0 + uVar110 * 4);
              auVar145._4_4_ = uVar116;
              auVar145._0_4_ = uVar116;
              auVar145._8_4_ = uVar116;
              auVar145._12_4_ = uVar116;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar110 * 4);
              fVar136 = 1.0 - local_400;
              auVar186 = vfmadd231ss_fma(ZEXT416((uint)(fVar136 * fVar136)),
                                         ZEXT416((uint)(local_400 * fVar136)),ZEXT416(0xc0000000));
              auVar219 = vfmsub132ss_fma(ZEXT416((uint)(local_400 * fVar136)),
                                         ZEXT416((uint)(local_400 * local_400)),ZEXT416(0x40000000))
              ;
              fVar161 = auVar219._0_4_ * 3.0;
              fVar135 = local_400 * local_400 * 3.0;
              auVar196._0_4_ = fVar135 * (float)local_560._0_4_;
              auVar196._4_4_ = fVar135 * (float)local_560._4_4_;
              auVar196._8_4_ = fVar135 * fStack_558;
              auVar196._12_4_ = fVar135 * fStack_554;
              auVar172._4_4_ = fVar161;
              auVar172._0_4_ = fVar161;
              auVar172._8_4_ = fVar161;
              auVar172._12_4_ = fVar161;
              auVar219 = vfmadd132ps_fma(auVar172,auVar196,_local_540);
              fVar161 = auVar186._0_4_ * 3.0;
              auVar191._4_4_ = fVar161;
              auVar191._0_4_ = fVar161;
              auVar191._8_4_ = fVar161;
              auVar191._12_4_ = fVar161;
              auVar219 = vfmadd132ps_fma(auVar191,auVar219,local_5a0._0_16_);
              fVar161 = fVar136 * fVar136 * -3.0;
              local_7b0.context = context->user;
              auVar173._4_4_ = fVar161;
              auVar173._0_4_ = fVar161;
              auVar173._8_4_ = fVar161;
              auVar173._12_4_ = fVar161;
              auVar186 = vfmadd132ps_fma(auVar173,auVar219,auVar7);
              local_430 = auVar186._0_4_;
              uStack_42c = local_430;
              uStack_428 = local_430;
              uStack_424 = local_430;
              auVar219 = vshufps_avx(auVar186,auVar186,0x55);
              local_420 = auVar219;
              local_410 = vshufps_avx(auVar186,auVar186,0xaa);
              fStack_3fc = local_400;
              fStack_3f8 = local_400;
              fStack_3f4 = local_400;
              local_3f0 = auVar145;
              local_3e0 = local_740;
              uStack_3d8 = uStack_738;
              local_3d0 = local_800._0_16_;
              vpcmpeqd_avx2(ZEXT1632(local_800._0_16_),ZEXT1632(local_800._0_16_));
              uStack_3bc = (local_7b0.context)->instID[0];
              local_3c0 = uStack_3bc;
              uStack_3b8 = uStack_3bc;
              uStack_3b4 = uStack_3bc;
              uStack_3b0 = (local_7b0.context)->instPrimID[0];
              uStack_3ac = uStack_3b0;
              uStack_3a8 = uStack_3b0;
              uStack_3a4 = uStack_3b0;
              local_880 = local_580._0_8_;
              uStack_878 = local_580._8_8_;
              local_7b0.valid = (int *)&local_880;
              local_7b0.geometryUserPtr = pGVar15->userPtr;
              local_7b0.hit = (RTCHitN *)&local_430;
              local_7b0.N = 4;
              local_7b0.ray = (RTCRayN *)ray;
              if (pGVar15->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar15->intersectionFilterN)(&local_7b0);
                auVar180._8_56_ = extraout_var;
                auVar180._0_8_ = extraout_XMM1_Qa;
                auVar145 = auVar180._0_16_;
                auVar241 = ZEXT3264(local_660);
                auVar216 = ZEXT3264(local_780);
                auVar251 = ZEXT3264(local_860);
                auVar227 = ZEXT3264(local_820);
                auVar180 = ZEXT3264(local_640);
                auVar223 = ZEXT3264(local_620);
                fVar228 = local_760;
                fVar134 = fStack_75c;
                fVar205 = fStack_758;
                fVar206 = fStack_754;
                fVar207 = fStack_750;
                fVar208 = fStack_74c;
                fVar209 = fStack_748;
                fVar242 = (float)local_840;
                fVar244 = local_840._4_4_;
                fVar141 = (float)uStack_838;
                fVar160 = uStack_838._4_4_;
                fVar245 = (float)uStack_830;
                fVar246 = uStack_830._4_4_;
                fVar247 = (float)uStack_828;
                fVar248 = uStack_828._4_4_;
                uVar117 = local_6a0;
                uVar234 = uStack_698;
                uVar235 = uStack_690;
                uVar236 = uStack_688;
              }
              auVar103._8_8_ = uStack_878;
              auVar103._0_8_ = local_880;
              if (auVar103 == (undefined1  [16])0x0) {
                auVar219 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                auVar186 = vpcmpeqd_avx(auVar145,auVar145);
                auVar219 = auVar219 ^ auVar186;
              }
              else {
                p_Var19 = context->args->filter;
                auVar186 = vpcmpeqd_avx(auVar219,auVar219);
                if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar15->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var19)(&local_7b0);
                  auVar241 = ZEXT3264(local_660);
                  auVar216 = ZEXT3264(local_780);
                  auVar251 = ZEXT3264(local_860);
                  auVar227 = ZEXT3264(local_820);
                  auVar180 = ZEXT3264(local_640);
                  auVar223 = ZEXT3264(local_620);
                  auVar186 = vpcmpeqd_avx(auVar186,auVar186);
                  fVar228 = local_760;
                  fVar134 = fStack_75c;
                  fVar205 = fStack_758;
                  fVar206 = fStack_754;
                  fVar207 = fStack_750;
                  fVar208 = fStack_74c;
                  fVar209 = fStack_748;
                  fVar242 = (float)local_840;
                  fVar244 = local_840._4_4_;
                  fVar141 = (float)uStack_838;
                  fVar160 = uStack_838._4_4_;
                  fVar245 = (float)uStack_830;
                  fVar246 = uStack_830._4_4_;
                  fVar247 = (float)uStack_828;
                  fVar248 = uStack_828._4_4_;
                  uVar117 = local_6a0;
                  uVar234 = uStack_698;
                  uVar235 = uStack_690;
                  uVar236 = uStack_688;
                }
                auVar104._8_8_ = uStack_878;
                auVar104._0_8_ = local_880;
                auVar5 = vpcmpeqd_avx(auVar104,_DAT_01feba10);
                auVar219 = auVar5 ^ auVar186;
                if (auVar104 != (undefined1  [16])0x0) {
                  auVar5 = auVar5 ^ auVar186;
                  auVar186 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])local_7b0.hit);
                  *(undefined1 (*) [16])(local_7b0.ray + 0xc0) = auVar186;
                  auVar186 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x10));
                  *(undefined1 (*) [16])(local_7b0.ray + 0xd0) = auVar186;
                  auVar186 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x20));
                  *(undefined1 (*) [16])(local_7b0.ray + 0xe0) = auVar186;
                  auVar186 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x30));
                  *(undefined1 (*) [16])(local_7b0.ray + 0xf0) = auVar186;
                  auVar186 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x40));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x100) = auVar186;
                  auVar186 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x50));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x110) = auVar186;
                  auVar186 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x60));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x120) = auVar186;
                  auVar186 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x70));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x130) = auVar186;
                  auVar186 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])(local_7b0.hit + 0x80));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x140) = auVar186;
                }
              }
              auVar176 = auVar180._0_32_;
              auVar146._8_8_ = 0x100000001;
              auVar146._0_8_ = 0x100000001;
              if ((auVar146 & auVar219) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = local_7e0._0_4_;
              }
              *(undefined4 *)(local_600 + uVar110 * 4) = 0;
              uVar116 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar133._4_4_ = uVar116;
              auVar133._0_4_ = uVar116;
              auVar133._8_4_ = uVar116;
              auVar133._12_4_ = uVar116;
              auVar133._16_4_ = uVar116;
              auVar133._20_4_ = uVar116;
              auVar133._24_4_ = uVar116;
              auVar133._28_4_ = uVar116;
              auVar130 = vcmpps_avx(auVar176,auVar133,2);
              auVar147 = vandps_avx(auVar130,local_600);
              local_600 = local_600 & auVar130;
              bVar94 = (local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
              bVar95 = (local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
              bVar93 = (local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
              bVar92 = SUB321(local_600 >> 0x7f,0) != '\0';
              bVar91 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
              bVar90 = SUB321(local_600 >> 0xbf,0) != '\0';
              bVar88 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
              bVar86 = local_600[0x1f] < '\0';
              if (((((((bVar94 || bVar95) || bVar93) || bVar92) || bVar91) || bVar90) || bVar88) ||
                  bVar86) {
                auVar159._8_4_ = 0x7f800000;
                auVar159._0_8_ = 0x7f8000007f800000;
                auVar159._12_4_ = 0x7f800000;
                auVar159._16_4_ = 0x7f800000;
                auVar159._20_4_ = 0x7f800000;
                auVar159._24_4_ = 0x7f800000;
                auVar159._28_4_ = 0x7f800000;
                auVar130 = vblendvps_avx(auVar159,auVar176,auVar147);
                auVar20 = vshufps_avx(auVar130,auVar130,0xb1);
                auVar20 = vminps_avx(auVar130,auVar20);
                auVar128 = vshufpd_avx(auVar20,auVar20,5);
                auVar20 = vminps_avx(auVar20,auVar128);
                auVar128 = vpermpd_avx2(auVar20,0x4e);
                auVar20 = vminps_avx(auVar20,auVar128);
                auVar20 = vcmpps_avx(auVar130,auVar20,0);
                auVar128 = auVar147 & auVar20;
                auVar130 = auVar147;
                if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar128 >> 0x7f,0) != '\0') ||
                      (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar128 >> 0xbf,0) != '\0') ||
                    (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar128[0x1f] < '\0') {
                  auVar130 = vandps_avx(auVar20,auVar147);
                }
                uVar109 = vmovmskps_avx(auVar130);
                uVar111 = 0;
                for (; (uVar109 & 1) == 0; uVar109 = uVar109 >> 1 | 0x80000000) {
                  uVar111 = uVar111 + 1;
                }
                uVar110 = (ulong)uVar111;
              }
              local_600 = auVar147;
              auVar147 = auVar223._0_32_;
            } while (((((((bVar94 || bVar95) || bVar93) || bVar92) || bVar91) || bVar90) || bVar88)
                     || bVar86);
          }
        }
      }
      local_620 = auVar147;
      auVar180 = ZEXT464((uint)fVar162);
      local_640 = auVar176;
      if (8 < iVar14) {
        local_660 = auVar241._0_32_;
        local_580._4_4_ = iVar14;
        local_580._0_4_ = iVar14;
        local_580._8_4_ = iVar14;
        local_580._12_4_ = iVar14;
        local_580._16_4_ = iVar14;
        local_580._20_4_ = iVar14;
        local_580._24_4_ = iVar14;
        local_580._28_4_ = iVar14;
        local_120 = fVar162;
        fStack_11c = fVar162;
        fStack_118 = fVar162;
        fStack_114 = fVar162;
        fStack_110 = fVar162;
        fStack_10c = fVar162;
        fStack_108 = fVar162;
        fStack_104 = fVar162;
        local_140 = local_680._0_4_;
        uStack_13c = local_680._0_4_;
        uStack_138 = local_680._0_4_;
        uStack_134 = local_680._0_4_;
        uStack_130 = local_680._0_4_;
        uStack_12c = local_680._0_4_;
        uStack_128 = local_680._0_4_;
        uStack_124 = local_680._0_4_;
        local_160 = 1.0 / (float)local_6c0._0_4_;
        fStack_15c = local_160;
        fStack_158 = local_160;
        fStack_154 = local_160;
        fStack_150 = local_160;
        fStack_14c = local_160;
        fStack_148 = local_160;
        fStack_144 = local_160;
        local_1c0 = uVar12;
        uStack_1bc = uVar12;
        uStack_1b8 = uVar12;
        uStack_1b4 = uVar12;
        local_1d0 = uVar13;
        uStack_1cc = uVar13;
        uStack_1c8 = uVar13;
        uStack_1c4 = uVar13;
        lVar114 = 8;
        local_6a0 = uVar117;
        uStack_698 = uVar234;
        uStack_690 = uVar235;
        uStack_688 = uVar236;
        do {
          auVar147 = *(undefined1 (*) [32])(bezier_basis0 + lVar114 * 4 + lVar22);
          auVar130 = *(undefined1 (*) [32])(lVar22 + 0x2227768 + lVar114 * 4);
          auVar20 = *(undefined1 (*) [32])(lVar22 + 0x2227bec + lVar114 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar22 + 0x2228070 + lVar114 * 4);
          fVar161 = *(float *)*pauVar2;
          fVar135 = *(float *)(*pauVar2 + 4);
          fVar136 = *(float *)(*pauVar2 + 8);
          fVar137 = *(float *)(*pauVar2 + 0xc);
          fVar138 = *(float *)(*pauVar2 + 0x10);
          fVar139 = *(float *)(*pauVar2 + 0x14);
          fVar140 = *(float *)(*pauVar2 + 0x18);
          auVar107 = *(undefined1 (*) [28])*pauVar2;
          auVar240._0_4_ = fVar161 * fVar228;
          auVar240._4_4_ = fVar135 * fVar134;
          auVar240._8_4_ = fVar136 * fVar205;
          auVar240._12_4_ = fVar137 * fVar206;
          auVar240._16_4_ = fVar138 * fVar207;
          auVar240._20_4_ = fVar139 * fVar208;
          auVar240._28_36_ = auVar241._28_36_;
          auVar240._24_4_ = fVar140 * fVar209;
          auVar223._0_4_ = fVar242 * fVar161;
          auVar223._4_4_ = fVar244 * fVar135;
          auVar223._8_4_ = fVar141 * fVar136;
          auVar223._12_4_ = fVar160 * fVar137;
          auVar223._16_4_ = fVar245 * fVar138;
          auVar223._20_4_ = fVar246 * fVar139;
          auVar223._28_36_ = auVar180._28_36_;
          auVar223._24_4_ = fVar247 * fVar140;
          auVar219 = vfmadd231ps_fma(auVar240._0_32_,auVar20,local_6e0);
          auVar186 = vfmadd231ps_fma(auVar223._0_32_,auVar20,auVar227._0_32_);
          auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),auVar130,auVar251._0_32_);
          auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar130,local_4a0);
          auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),auVar147,auVar216._0_32_);
          auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar147,local_4c0);
          auVar128 = *(undefined1 (*) [32])(bezier_basis1 + lVar114 * 4 + lVar22);
          auVar131 = *(undefined1 (*) [32])(lVar22 + 0x2229b88 + lVar114 * 4);
          auVar178 = *(undefined1 (*) [32])(lVar22 + 0x222a00c + lVar114 * 4);
          pfVar1 = (float *)(lVar22 + 0x222a490 + lVar114 * 4);
          fVar229 = *pfVar1;
          fVar233 = pfVar1[1];
          fVar96 = pfVar1[2];
          fVar97 = pfVar1[3];
          fVar98 = pfVar1[4];
          fVar99 = pfVar1[5];
          fVar100 = pfVar1[6];
          auVar241._0_4_ = fVar229 * fVar228;
          auVar241._4_4_ = fVar233 * fVar134;
          auVar241._8_4_ = fVar96 * fVar205;
          auVar241._12_4_ = fVar97 * fVar206;
          auVar241._16_4_ = fVar98 * fVar207;
          auVar241._20_4_ = fVar99 * fVar208;
          auVar241._28_36_ = auVar216._28_36_;
          auVar241._24_4_ = fVar100 * fVar209;
          auVar56._4_4_ = fVar233 * fVar244;
          auVar56._0_4_ = fVar229 * fVar242;
          auVar56._8_4_ = fVar96 * fVar141;
          auVar56._12_4_ = fVar97 * fVar160;
          auVar56._16_4_ = fVar98 * fVar245;
          auVar56._20_4_ = fVar99 * fVar246;
          auVar56._24_4_ = fVar100 * fVar247;
          auVar56._28_4_ = fVar248;
          auVar5 = vfmadd231ps_fma(auVar241._0_32_,auVar178,local_6e0);
          auVar6 = vfmadd231ps_fma(auVar56,auVar178,auVar227._0_32_);
          auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar131,auVar251._0_32_);
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar131,local_4a0);
          auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar128,auVar216._0_32_);
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar128,local_4c0);
          _local_560 = ZEXT1632(auVar5);
          local_680 = ZEXT1632(auVar219);
          local_5a0 = vsubps_avx(_local_560,local_680);
          auVar120 = ZEXT1632(auVar6);
          auVar176 = ZEXT1632(auVar186);
          auVar213 = vsubps_avx(auVar120,auVar176);
          auVar89._4_4_ = auVar186._4_4_ * local_5a0._4_4_;
          auVar89._0_4_ = auVar186._0_4_ * local_5a0._0_4_;
          auVar89._8_4_ = auVar186._8_4_ * local_5a0._8_4_;
          auVar89._12_4_ = auVar186._12_4_ * local_5a0._12_4_;
          auVar89._16_4_ = local_5a0._16_4_ * 0.0;
          auVar89._20_4_ = local_5a0._20_4_ * 0.0;
          auVar89._24_4_ = local_5a0._24_4_ * 0.0;
          auVar89._28_4_ = local_4c0._28_4_;
          fVar162 = auVar213._0_4_;
          fVar134 = auVar213._4_4_;
          auVar87._4_4_ = auVar219._4_4_ * fVar134;
          auVar87._0_4_ = auVar219._0_4_ * fVar162;
          fVar205 = auVar213._8_4_;
          auVar87._8_4_ = auVar219._8_4_ * fVar205;
          fVar206 = auVar213._12_4_;
          auVar87._12_4_ = auVar219._12_4_ * fVar206;
          fVar207 = auVar213._16_4_;
          auVar87._16_4_ = fVar207 * 0.0;
          fVar208 = auVar213._20_4_;
          auVar87._20_4_ = fVar208 * 0.0;
          fVar209 = auVar213._24_4_;
          auVar87._24_4_ = fVar209 * 0.0;
          auVar87._28_4_ = local_6e0._28_4_;
          auVar21 = vsubps_avx(auVar89,auVar87);
          auVar57._4_4_ = fVar135 * local_e0._4_4_;
          auVar57._0_4_ = fVar161 * (float)local_e0;
          auVar57._8_4_ = fVar136 * (float)uStack_d8;
          auVar57._12_4_ = fVar137 * uStack_d8._4_4_;
          auVar57._16_4_ = fVar138 * (float)uStack_d0;
          auVar57._20_4_ = fVar139 * uStack_d0._4_4_;
          auVar57._24_4_ = fVar140 * (float)uStack_c8;
          auVar57._28_4_ = local_6e0._28_4_;
          auVar241 = ZEXT3264(local_c0);
          auVar219 = vfmadd231ps_fma(auVar57,local_c0,auVar20);
          auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),local_660,auVar130);
          auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),local_a0,auVar147);
          auVar58._4_4_ = fVar233 * local_e0._4_4_;
          auVar58._0_4_ = fVar229 * (float)local_e0;
          auVar58._8_4_ = fVar96 * (float)uStack_d8;
          auVar58._12_4_ = fVar97 * uStack_d8._4_4_;
          auVar58._16_4_ = fVar98 * (float)uStack_d0;
          auVar58._20_4_ = fVar99 * uStack_d0._4_4_;
          auVar58._24_4_ = fVar100 * (float)uStack_c8;
          auVar58._28_4_ = uStack_c8._4_4_;
          auVar186 = vfmadd231ps_fma(auVar58,auVar178,local_c0);
          auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar131,local_660);
          auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar128,local_a0);
          auVar180 = ZEXT1664(auVar186);
          auVar59._4_4_ = fVar134 * fVar134;
          auVar59._0_4_ = fVar162 * fVar162;
          auVar59._8_4_ = fVar205 * fVar205;
          auVar59._12_4_ = fVar206 * fVar206;
          auVar59._16_4_ = fVar207 * fVar207;
          auVar59._20_4_ = fVar208 * fVar208;
          auVar59._24_4_ = fVar209 * fVar209;
          auVar59._28_4_ = *(undefined4 *)(*pauVar2 + 0x1c);
          auVar5 = vfmadd231ps_fma(auVar59,local_5a0,local_5a0);
          local_4e0 = ZEXT1632(auVar219);
          local_500 = ZEXT1632(auVar186);
          auVar222 = vmaxps_avx(local_4e0,local_500);
          auVar220._0_4_ = auVar222._0_4_ * auVar222._0_4_ * auVar5._0_4_;
          auVar220._4_4_ = auVar222._4_4_ * auVar222._4_4_ * auVar5._4_4_;
          auVar220._8_4_ = auVar222._8_4_ * auVar222._8_4_ * auVar5._8_4_;
          auVar220._12_4_ = auVar222._12_4_ * auVar222._12_4_ * auVar5._12_4_;
          auVar220._16_4_ = auVar222._16_4_ * auVar222._16_4_ * 0.0;
          auVar220._20_4_ = auVar222._20_4_ * auVar222._20_4_ * 0.0;
          auVar220._24_4_ = auVar222._24_4_ * auVar222._24_4_ * 0.0;
          auVar220._28_4_ = 0;
          auVar60._4_4_ = auVar21._4_4_ * auVar21._4_4_;
          auVar60._0_4_ = auVar21._0_4_ * auVar21._0_4_;
          auVar60._8_4_ = auVar21._8_4_ * auVar21._8_4_;
          auVar60._12_4_ = auVar21._12_4_ * auVar21._12_4_;
          auVar60._16_4_ = auVar21._16_4_ * auVar21._16_4_;
          auVar60._20_4_ = auVar21._20_4_ * auVar21._20_4_;
          auVar60._24_4_ = auVar21._24_4_ * auVar21._24_4_;
          auVar60._28_4_ = auVar21._28_4_;
          auVar222 = vcmpps_avx(auVar60,auVar220,2);
          local_340 = (int)lVar114;
          auVar221._4_4_ = local_340;
          auVar221._0_4_ = local_340;
          auVar221._8_4_ = local_340;
          auVar221._12_4_ = local_340;
          auVar221._16_4_ = local_340;
          auVar221._20_4_ = local_340;
          auVar221._24_4_ = local_340;
          auVar221._28_4_ = local_340;
          auVar21 = vpor_avx2(auVar221,_DAT_0205a920);
          auVar177 = vpcmpgtd_avx2(local_580,auVar21);
          auVar21 = auVar177 & auVar222;
          fVar228 = local_760;
          fVar134 = fStack_75c;
          fVar205 = fStack_758;
          fVar206 = fStack_754;
          fVar207 = fStack_750;
          fVar208 = fStack_74c;
          fVar209 = fStack_748;
          fVar242 = (float)local_840;
          fVar244 = local_840._4_4_;
          fVar141 = (float)uStack_838;
          fVar160 = uStack_838._4_4_;
          fVar245 = (float)uStack_830;
          fVar246 = uStack_830._4_4_;
          fVar247 = (float)uStack_828;
          fVar248 = uStack_828._4_4_;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0x7f,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0xbf,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar21[0x1f]) {
LAB_01991d85:
            auVar251 = ZEXT3264(local_860);
            auVar227 = ZEXT3264(local_820);
            auVar216 = ZEXT3264(local_780);
          }
          else {
            local_200 = vandps_avx(auVar177,auVar222);
            auVar61._4_4_ = fVar233 * local_6a0._4_4_;
            auVar61._0_4_ = fVar229 * (float)local_6a0;
            auVar61._8_4_ = fVar96 * (float)uStack_698;
            auVar61._12_4_ = fVar97 * uStack_698._4_4_;
            auVar61._16_4_ = fVar98 * (float)uStack_690;
            auVar61._20_4_ = fVar99 * uStack_690._4_4_;
            auVar61._24_4_ = fVar100 * (float)uStack_688;
            auVar61._28_4_ = auVar222._28_4_;
            auVar219 = vfmadd213ps_fma(auVar178,local_480,auVar61);
            auVar219 = vfmadd213ps_fma(auVar131,local_460,ZEXT1632(auVar219));
            auVar219 = vfmadd213ps_fma(auVar128,local_180,ZEXT1632(auVar219));
            local_220 = ZEXT1632(auVar219);
            local_540._0_4_ = auVar107._0_4_;
            local_540._4_4_ = auVar107._4_4_;
            fStack_538 = auVar107._8_4_;
            fStack_534 = auVar107._12_4_;
            auStack_530._0_4_ = auVar107._16_4_;
            auStack_530._4_4_ = auVar107._20_4_;
            fStack_528 = auVar107._24_4_;
            auVar62._4_4_ = local_6a0._4_4_ * (float)local_540._4_4_;
            auVar62._0_4_ = (float)local_6a0 * (float)local_540._0_4_;
            auVar62._8_4_ = (float)uStack_698 * fStack_538;
            auVar62._12_4_ = uStack_698._4_4_ * fStack_534;
            auVar62._16_4_ = (float)uStack_690 * (float)auStack_530._0_4_;
            auVar62._20_4_ = uStack_690._4_4_ * (float)auStack_530._4_4_;
            auVar62._24_4_ = (float)uStack_688 * fStack_528;
            auVar62._28_4_ = auVar222._28_4_;
            auVar219 = vfmadd213ps_fma(auVar20,local_480,auVar62);
            auVar219 = vfmadd213ps_fma(auVar130,local_460,ZEXT1632(auVar219));
            auVar130 = *(undefined1 (*) [32])(lVar22 + 0x22284f4 + lVar114 * 4);
            auVar20 = *(undefined1 (*) [32])(lVar22 + 0x2228978 + lVar114 * 4);
            auVar128 = *(undefined1 (*) [32])(lVar22 + 0x2228dfc + lVar114 * 4);
            pfVar1 = (float *)(lVar22 + 0x2229280 + lVar114 * 4);
            fVar162 = *pfVar1;
            fVar161 = pfVar1[1];
            fVar135 = pfVar1[2];
            fVar136 = pfVar1[3];
            fVar137 = pfVar1[4];
            fVar138 = pfVar1[5];
            fVar139 = pfVar1[6];
            auVar214._0_4_ = fVar162 * local_760;
            auVar214._4_4_ = fVar161 * fStack_75c;
            auVar214._8_4_ = fVar135 * fStack_758;
            auVar214._12_4_ = fVar136 * fStack_754;
            auVar214._16_4_ = fVar137 * fStack_750;
            auVar214._20_4_ = fVar138 * fStack_74c;
            auVar214._24_4_ = fVar139 * fStack_748;
            auVar214._28_4_ = 0;
            auVar231._0_4_ = (float)local_840 * fVar162;
            auVar231._4_4_ = local_840._4_4_ * fVar161;
            auVar231._8_4_ = (float)uStack_838 * fVar135;
            auVar231._12_4_ = uStack_838._4_4_ * fVar136;
            auVar231._16_4_ = (float)uStack_830 * fVar137;
            auVar231._20_4_ = uStack_830._4_4_ * fVar138;
            auVar231._24_4_ = (float)uStack_828 * fVar139;
            auVar231._28_4_ = 0;
            auVar63._4_4_ = fVar161 * local_6a0._4_4_;
            auVar63._0_4_ = fVar162 * (float)local_6a0;
            auVar63._8_4_ = fVar135 * (float)uStack_698;
            auVar63._12_4_ = fVar136 * uStack_698._4_4_;
            auVar63._16_4_ = fVar137 * (float)uStack_690;
            auVar63._20_4_ = fVar138 * uStack_690._4_4_;
            auVar63._24_4_ = fVar139 * (float)uStack_688;
            auVar63._28_4_ = pfVar1[7];
            auVar186 = vfmadd231ps_fma(auVar214,auVar128,local_6e0);
            auVar5 = vfmadd231ps_fma(auVar231,auVar128,local_820);
            auVar6 = vfmadd231ps_fma(auVar63,local_480,auVar128);
            auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar20,local_860);
            auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar20,local_4a0);
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),local_460,auVar20);
            auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar130,local_780);
            auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar130,local_4c0);
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),local_180,auVar130);
            pfVar1 = (float *)(lVar22 + 0x222b6a0 + lVar114 * 4);
            fVar162 = *pfVar1;
            fVar161 = pfVar1[1];
            fVar135 = pfVar1[2];
            fVar136 = pfVar1[3];
            fVar137 = pfVar1[4];
            fVar138 = pfVar1[5];
            fVar139 = pfVar1[6];
            auVar64._4_4_ = fStack_75c * fVar161;
            auVar64._0_4_ = local_760 * fVar162;
            auVar64._8_4_ = fStack_758 * fVar135;
            auVar64._12_4_ = fStack_754 * fVar136;
            auVar64._16_4_ = fStack_750 * fVar137;
            auVar64._20_4_ = fStack_74c * fVar138;
            auVar64._24_4_ = fStack_748 * fVar139;
            auVar64._28_4_ = local_180._28_4_;
            auVar65._4_4_ = local_840._4_4_ * fVar161;
            auVar65._0_4_ = (float)local_840 * fVar162;
            auVar65._8_4_ = (float)uStack_838 * fVar135;
            auVar65._12_4_ = uStack_838._4_4_ * fVar136;
            auVar65._16_4_ = (float)uStack_830 * fVar137;
            auVar65._20_4_ = uStack_830._4_4_ * fVar138;
            auVar65._24_4_ = (float)uStack_828 * fVar139;
            auVar65._28_4_ = uStack_828._4_4_;
            auVar66._4_4_ = fVar161 * local_6a0._4_4_;
            auVar66._0_4_ = fVar162 * (float)local_6a0;
            auVar66._8_4_ = fVar135 * (float)uStack_698;
            auVar66._12_4_ = fVar136 * uStack_698._4_4_;
            auVar66._16_4_ = fVar137 * (float)uStack_690;
            auVar66._20_4_ = fVar138 * uStack_690._4_4_;
            auVar66._24_4_ = fVar139 * (float)uStack_688;
            auVar66._28_4_ = pfVar1[7];
            auVar130 = *(undefined1 (*) [32])(lVar22 + 0x222b21c + lVar114 * 4);
            auVar202 = vfmadd231ps_fma(auVar64,auVar130,local_6e0);
            auVar8 = vfmadd231ps_fma(auVar65,auVar130,local_820);
            auVar9 = vfmadd231ps_fma(auVar66,local_480,auVar130);
            auVar130 = *(undefined1 (*) [32])(lVar22 + 0x222ad98 + lVar114 * 4);
            auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar130,local_860);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar130,local_4a0);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),local_460,auVar130);
            auVar130 = *(undefined1 (*) [32])(lVar22 + 0x222a914 + lVar114 * 4);
            auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar130,local_780);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar130,local_4c0);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),local_180,auVar130);
            auVar130 = vandps_avx(ZEXT1632(auVar186),local_1a0);
            auVar20 = vandps_avx(ZEXT1632(auVar5),local_1a0);
            auVar20 = vmaxps_avx(auVar130,auVar20);
            auVar130 = vandps_avx(ZEXT1632(auVar6),local_1a0);
            auVar130 = vmaxps_avx(auVar20,auVar130);
            auVar106._4_4_ = fStack_11c;
            auVar106._0_4_ = local_120;
            auVar106._8_4_ = fStack_118;
            auVar106._12_4_ = fStack_114;
            auVar106._16_4_ = fStack_110;
            auVar106._20_4_ = fStack_10c;
            auVar106._24_4_ = fStack_108;
            auVar106._28_4_ = fStack_104;
            auVar130 = vcmpps_avx(auVar130,auVar106,1);
            auVar128 = vblendvps_avx(ZEXT1632(auVar186),local_5a0,auVar130);
            auVar131 = vblendvps_avx(ZEXT1632(auVar5),auVar213,auVar130);
            auVar130 = vandps_avx(ZEXT1632(auVar202),local_1a0);
            auVar20 = vandps_avx(ZEXT1632(auVar8),local_1a0);
            auVar20 = vmaxps_avx(auVar130,auVar20);
            auVar130 = vandps_avx(local_1a0,ZEXT1632(auVar9));
            auVar130 = vmaxps_avx(auVar20,auVar130);
            auVar20 = vcmpps_avx(auVar130,auVar106,1);
            auVar130 = vblendvps_avx(ZEXT1632(auVar202),local_5a0,auVar20);
            auVar20 = vblendvps_avx(ZEXT1632(auVar8),auVar213,auVar20);
            auVar219 = vfmadd213ps_fma(auVar147,local_180,ZEXT1632(auVar219));
            auVar186 = vfmadd213ps_fma(auVar128,auVar128,ZEXT832(0) << 0x20);
            auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar131,auVar131);
            auVar147 = vrsqrtps_avx(ZEXT1632(auVar186));
            fVar162 = auVar147._0_4_;
            fVar161 = auVar147._4_4_;
            fVar135 = auVar147._8_4_;
            fVar136 = auVar147._12_4_;
            fVar137 = auVar147._16_4_;
            fVar138 = auVar147._20_4_;
            fVar139 = auVar147._24_4_;
            auVar67._4_4_ = fVar161 * fVar161 * fVar161 * auVar186._4_4_ * -0.5;
            auVar67._0_4_ = fVar162 * fVar162 * fVar162 * auVar186._0_4_ * -0.5;
            auVar67._8_4_ = fVar135 * fVar135 * fVar135 * auVar186._8_4_ * -0.5;
            auVar67._12_4_ = fVar136 * fVar136 * fVar136 * auVar186._12_4_ * -0.5;
            auVar67._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
            auVar67._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
            auVar67._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
            auVar67._28_4_ = 0;
            auVar243._8_4_ = 0x3fc00000;
            auVar243._0_8_ = 0x3fc000003fc00000;
            auVar243._12_4_ = 0x3fc00000;
            auVar243._16_4_ = 0x3fc00000;
            auVar243._20_4_ = 0x3fc00000;
            auVar243._24_4_ = 0x3fc00000;
            auVar243._28_4_ = 0x3fc00000;
            auVar186 = vfmadd231ps_fma(auVar67,auVar243,auVar147);
            fVar162 = auVar186._0_4_;
            fVar161 = auVar186._4_4_;
            auVar68._4_4_ = auVar131._4_4_ * fVar161;
            auVar68._0_4_ = auVar131._0_4_ * fVar162;
            fVar135 = auVar186._8_4_;
            auVar68._8_4_ = auVar131._8_4_ * fVar135;
            fVar136 = auVar186._12_4_;
            auVar68._12_4_ = auVar131._12_4_ * fVar136;
            auVar68._16_4_ = auVar131._16_4_ * 0.0;
            auVar68._20_4_ = auVar131._20_4_ * 0.0;
            auVar68._24_4_ = auVar131._24_4_ * 0.0;
            auVar68._28_4_ = auVar131._28_4_;
            auVar69._4_4_ = fVar161 * -auVar128._4_4_;
            auVar69._0_4_ = fVar162 * -auVar128._0_4_;
            auVar69._8_4_ = fVar135 * -auVar128._8_4_;
            auVar69._12_4_ = fVar136 * -auVar128._12_4_;
            auVar69._16_4_ = -auVar128._16_4_ * 0.0;
            auVar69._20_4_ = -auVar128._20_4_ * 0.0;
            auVar69._24_4_ = -auVar128._24_4_ * 0.0;
            auVar69._28_4_ = auVar147._28_4_;
            auVar186 = vfmadd213ps_fma(auVar130,auVar130,ZEXT832(0) << 0x20);
            auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar20,auVar20);
            auVar147 = vrsqrtps_avx(ZEXT1632(auVar186));
            auVar70._28_4_ = local_4c0._28_4_;
            auVar70._0_28_ =
                 ZEXT1628(CONCAT412(fVar136 * 0.0,
                                    CONCAT48(fVar135 * 0.0,CONCAT44(fVar161 * 0.0,fVar162 * 0.0))));
            fVar162 = auVar147._0_4_;
            fVar161 = auVar147._4_4_;
            fVar135 = auVar147._8_4_;
            fVar136 = auVar147._12_4_;
            fVar137 = auVar147._16_4_;
            fVar138 = auVar147._20_4_;
            fVar139 = auVar147._24_4_;
            auVar71._4_4_ = fVar161 * fVar161 * fVar161 * auVar186._4_4_ * -0.5;
            auVar71._0_4_ = fVar162 * fVar162 * fVar162 * auVar186._0_4_ * -0.5;
            auVar71._8_4_ = fVar135 * fVar135 * fVar135 * auVar186._8_4_ * -0.5;
            auVar71._12_4_ = fVar136 * fVar136 * fVar136 * auVar186._12_4_ * -0.5;
            auVar71._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
            auVar71._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
            auVar71._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
            auVar71._28_4_ = 0;
            auVar186 = vfmadd231ps_fma(auVar71,auVar243,auVar147);
            fVar162 = auVar186._0_4_;
            fVar161 = auVar186._4_4_;
            auVar72._4_4_ = auVar20._4_4_ * fVar161;
            auVar72._0_4_ = auVar20._0_4_ * fVar162;
            fVar135 = auVar186._8_4_;
            auVar72._8_4_ = auVar20._8_4_ * fVar135;
            fVar136 = auVar186._12_4_;
            auVar72._12_4_ = auVar20._12_4_ * fVar136;
            auVar72._16_4_ = auVar20._16_4_ * 0.0;
            auVar72._20_4_ = auVar20._20_4_ * 0.0;
            auVar72._24_4_ = auVar20._24_4_ * 0.0;
            auVar72._28_4_ = 0;
            auVar73._4_4_ = fVar161 * -auVar130._4_4_;
            auVar73._0_4_ = fVar162 * -auVar130._0_4_;
            auVar73._8_4_ = fVar135 * -auVar130._8_4_;
            auVar73._12_4_ = fVar136 * -auVar130._12_4_;
            auVar73._16_4_ = -auVar130._16_4_ * 0.0;
            auVar73._20_4_ = -auVar130._20_4_ * 0.0;
            auVar73._24_4_ = -auVar130._24_4_ * 0.0;
            auVar73._28_4_ = auVar147._28_4_;
            auVar74._28_4_ = 0xbf000000;
            auVar74._0_28_ =
                 ZEXT1628(CONCAT412(fVar136 * 0.0,
                                    CONCAT48(fVar135 * 0.0,CONCAT44(fVar161 * 0.0,fVar162 * 0.0))));
            auVar186 = vfmadd213ps_fma(auVar68,local_4e0,local_680);
            auVar5 = vfmadd213ps_fma(auVar69,local_4e0,auVar176);
            auVar6 = vfmadd213ps_fma(auVar70,local_4e0,ZEXT1632(auVar219));
            auVar118 = vfnmadd213ps_fma(auVar68,local_4e0,local_680);
            auVar202 = vfmadd213ps_fma(auVar72,local_500,_local_560);
            auVar163 = vfnmadd213ps_fma(auVar69,local_4e0,auVar176);
            auVar8 = vfmadd213ps_fma(auVar73,local_500,auVar120);
            auVar219 = vfnmadd231ps_fma(ZEXT1632(auVar219),local_4e0,auVar70);
            auVar9 = vfmadd213ps_fma(auVar74,local_500,local_220);
            auVar23 = vfnmadd213ps_fma(auVar72,local_500,_local_560);
            auVar119 = vfnmadd213ps_fma(auVar73,local_500,auVar120);
            auVar142 = vfnmadd231ps_fma(local_220,local_500,auVar74);
            auVar147 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar163));
            auVar130 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar219));
            auVar75._4_4_ = auVar147._4_4_ * auVar219._4_4_;
            auVar75._0_4_ = auVar147._0_4_ * auVar219._0_4_;
            auVar75._8_4_ = auVar147._8_4_ * auVar219._8_4_;
            auVar75._12_4_ = auVar147._12_4_ * auVar219._12_4_;
            auVar75._16_4_ = auVar147._16_4_ * 0.0;
            auVar75._20_4_ = auVar147._20_4_ * 0.0;
            auVar75._24_4_ = auVar147._24_4_ * 0.0;
            auVar75._28_4_ = local_5a0._28_4_;
            auVar10 = vfmsub231ps_fma(auVar75,ZEXT1632(auVar163),auVar130);
            auVar76._4_4_ = auVar118._4_4_ * auVar130._4_4_;
            auVar76._0_4_ = auVar118._0_4_ * auVar130._0_4_;
            auVar76._8_4_ = auVar118._8_4_ * auVar130._8_4_;
            auVar76._12_4_ = auVar118._12_4_ * auVar130._12_4_;
            auVar76._16_4_ = auVar130._16_4_ * 0.0;
            auVar76._20_4_ = auVar130._20_4_ * 0.0;
            auVar76._24_4_ = auVar130._24_4_ * 0.0;
            auVar76._28_4_ = auVar130._28_4_;
            auVar222 = ZEXT1632(auVar118);
            auVar130 = vsubps_avx(ZEXT1632(auVar202),auVar222);
            auVar177 = ZEXT1632(auVar219);
            auVar219 = vfmsub231ps_fma(auVar76,auVar177,auVar130);
            auVar77._4_4_ = auVar163._4_4_ * auVar130._4_4_;
            auVar77._0_4_ = auVar163._0_4_ * auVar130._0_4_;
            auVar77._8_4_ = auVar163._8_4_ * auVar130._8_4_;
            auVar77._12_4_ = auVar163._12_4_ * auVar130._12_4_;
            auVar77._16_4_ = auVar130._16_4_ * 0.0;
            auVar77._20_4_ = auVar130._20_4_ * 0.0;
            auVar77._24_4_ = auVar130._24_4_ * 0.0;
            auVar77._28_4_ = auVar130._28_4_;
            auVar118 = vfmsub231ps_fma(auVar77,auVar222,auVar147);
            auVar219 = vfmadd231ps_fma(ZEXT1632(auVar118),ZEXT832(0) << 0x20,ZEXT1632(auVar219));
            auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
            auVar176 = vcmpps_avx(ZEXT1632(auVar219),ZEXT832(0) << 0x20,2);
            auVar147 = vblendvps_avx(ZEXT1632(auVar23),ZEXT1632(auVar186),auVar176);
            auVar130 = vblendvps_avx(ZEXT1632(auVar119),ZEXT1632(auVar5),auVar176);
            auVar20 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar6),auVar176);
            auVar128 = vblendvps_avx(auVar222,ZEXT1632(auVar202),auVar176);
            auVar131 = vblendvps_avx(ZEXT1632(auVar163),ZEXT1632(auVar8),auVar176);
            auVar178 = vblendvps_avx(auVar177,ZEXT1632(auVar9),auVar176);
            auVar222 = vblendvps_avx(ZEXT1632(auVar202),auVar222,auVar176);
            auVar21 = vblendvps_avx(ZEXT1632(auVar8),ZEXT1632(auVar163),auVar176);
            auVar219 = vpackssdw_avx(local_200._0_16_,local_200._16_16_);
            auVar177 = vblendvps_avx(ZEXT1632(auVar9),auVar177,auVar176);
            auVar222 = vsubps_avx(auVar222,auVar147);
            auVar202 = auVar222._0_16_;
            auVar21 = vsubps_avx(auVar21,auVar130);
            auVar120 = vsubps_avx(auVar177,auVar20);
            auVar122 = vsubps_avx(auVar147,auVar128);
            auVar149 = vsubps_avx(auVar130,auVar131);
            auVar187 = vsubps_avx(auVar20,auVar178);
            auVar241 = ZEXT3264(auVar187);
            auVar197._0_4_ = auVar120._0_4_ * auVar147._0_4_;
            auVar197._4_4_ = auVar120._4_4_ * auVar147._4_4_;
            auVar197._8_4_ = auVar120._8_4_ * auVar147._8_4_;
            auVar197._12_4_ = auVar120._12_4_ * auVar147._12_4_;
            auVar197._16_4_ = auVar120._16_4_ * auVar147._16_4_;
            auVar197._20_4_ = auVar120._20_4_ * auVar147._20_4_;
            auVar197._24_4_ = auVar120._24_4_ * auVar147._24_4_;
            auVar197._28_4_ = 0;
            auVar186 = vfmsub231ps_fma(auVar197,auVar20,auVar222);
            auVar78._4_4_ = auVar222._4_4_ * auVar130._4_4_;
            auVar78._0_4_ = auVar222._0_4_ * auVar130._0_4_;
            auVar78._8_4_ = auVar222._8_4_ * auVar130._8_4_;
            auVar78._12_4_ = auVar222._12_4_ * auVar130._12_4_;
            auVar78._16_4_ = auVar222._16_4_ * auVar130._16_4_;
            auVar78._20_4_ = auVar222._20_4_ * auVar130._20_4_;
            auVar78._24_4_ = auVar222._24_4_ * auVar130._24_4_;
            auVar78._28_4_ = auVar177._28_4_;
            auVar5 = vfmsub231ps_fma(auVar78,auVar147,auVar21);
            auVar186 = vfmadd231ps_fma(ZEXT1632(auVar5),ZEXT1632((undefined1  [16])0x0),
                                       ZEXT1632(auVar186));
            auVar198._0_4_ = auVar21._0_4_ * auVar20._0_4_;
            auVar198._4_4_ = auVar21._4_4_ * auVar20._4_4_;
            auVar198._8_4_ = auVar21._8_4_ * auVar20._8_4_;
            auVar198._12_4_ = auVar21._12_4_ * auVar20._12_4_;
            auVar198._16_4_ = auVar21._16_4_ * auVar20._16_4_;
            auVar198._20_4_ = auVar21._20_4_ * auVar20._20_4_;
            auVar198._24_4_ = auVar21._24_4_ * auVar20._24_4_;
            auVar198._28_4_ = 0;
            auVar5 = vfmsub231ps_fma(auVar198,auVar130,auVar120);
            auVar5 = vfmadd231ps_fma(ZEXT1632(auVar186),ZEXT1632((undefined1  [16])0x0),
                                     ZEXT1632(auVar5));
            auVar180 = ZEXT1664(auVar5);
            auVar199._0_4_ = auVar187._0_4_ * auVar128._0_4_;
            auVar199._4_4_ = auVar187._4_4_ * auVar128._4_4_;
            auVar199._8_4_ = auVar187._8_4_ * auVar128._8_4_;
            auVar199._12_4_ = auVar187._12_4_ * auVar128._12_4_;
            auVar199._16_4_ = auVar187._16_4_ * auVar128._16_4_;
            auVar199._20_4_ = auVar187._20_4_ * auVar128._20_4_;
            auVar199._24_4_ = auVar187._24_4_ * auVar128._24_4_;
            auVar199._28_4_ = 0;
            auVar186 = vfmsub231ps_fma(auVar199,auVar122,auVar178);
            auVar79._4_4_ = auVar149._4_4_ * auVar178._4_4_;
            auVar79._0_4_ = auVar149._0_4_ * auVar178._0_4_;
            auVar79._8_4_ = auVar149._8_4_ * auVar178._8_4_;
            auVar79._12_4_ = auVar149._12_4_ * auVar178._12_4_;
            auVar79._16_4_ = auVar149._16_4_ * auVar178._16_4_;
            auVar79._20_4_ = auVar149._20_4_ * auVar178._20_4_;
            auVar79._24_4_ = auVar149._24_4_ * auVar178._24_4_;
            auVar79._28_4_ = auVar147._28_4_;
            auVar6 = vfmsub231ps_fma(auVar79,auVar131,auVar187);
            auVar80._4_4_ = auVar122._4_4_ * auVar131._4_4_;
            auVar80._0_4_ = auVar122._0_4_ * auVar131._0_4_;
            auVar80._8_4_ = auVar122._8_4_ * auVar131._8_4_;
            auVar80._12_4_ = auVar122._12_4_ * auVar131._12_4_;
            auVar80._16_4_ = auVar122._16_4_ * auVar131._16_4_;
            auVar80._20_4_ = auVar122._20_4_ * auVar131._20_4_;
            auVar80._24_4_ = auVar122._24_4_ * auVar131._24_4_;
            auVar80._28_4_ = auVar131._28_4_;
            auVar8 = vfmsub231ps_fma(auVar80,auVar149,auVar128);
            auVar131 = ZEXT1632((undefined1  [16])0x0);
            auVar186 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar131,ZEXT1632(auVar186));
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar131,ZEXT1632(auVar6));
            auVar128 = vmaxps_avx(ZEXT1632(auVar5),ZEXT1632(auVar6));
            auVar128 = vcmpps_avx(auVar128,auVar131,2);
            auVar186 = vpackssdw_avx(auVar128._0_16_,auVar128._16_16_);
            auVar219 = vpand_avx(auVar186,auVar219);
            auVar128 = vpmovsxwd_avx2(auVar219);
            if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar128 >> 0x7f,0) == '\0') &&
                  (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar128 >> 0xbf,0) == '\0') &&
                (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar128[0x1f]) {
LAB_019920c2:
              auVar189._8_8_ = uStack_5b8;
              auVar189._0_8_ = local_5c0;
              auVar189._16_8_ = uStack_5b0;
              auVar189._24_8_ = uStack_5a8;
              auVar219 = vpcmpeqd_avx(auVar202,auVar202);
              auVar223 = ZEXT1664(auVar219);
            }
            else {
              auVar81._4_4_ = auVar21._4_4_ * auVar187._4_4_;
              auVar81._0_4_ = auVar21._0_4_ * auVar187._0_4_;
              auVar81._8_4_ = auVar21._8_4_ * auVar187._8_4_;
              auVar81._12_4_ = auVar21._12_4_ * auVar187._12_4_;
              auVar81._16_4_ = auVar21._16_4_ * auVar187._16_4_;
              auVar81._20_4_ = auVar21._20_4_ * auVar187._20_4_;
              auVar81._24_4_ = auVar21._24_4_ * auVar187._24_4_;
              auVar81._28_4_ = auVar128._28_4_;
              auVar9 = vfmsub231ps_fma(auVar81,auVar149,auVar120);
              auVar201._0_4_ = auVar120._0_4_ * auVar122._0_4_;
              auVar201._4_4_ = auVar120._4_4_ * auVar122._4_4_;
              auVar201._8_4_ = auVar120._8_4_ * auVar122._8_4_;
              auVar201._12_4_ = auVar120._12_4_ * auVar122._12_4_;
              auVar201._16_4_ = auVar120._16_4_ * auVar122._16_4_;
              auVar201._20_4_ = auVar120._20_4_ * auVar122._20_4_;
              auVar201._24_4_ = auVar120._24_4_ * auVar122._24_4_;
              auVar201._28_4_ = 0;
              auVar8 = vfmsub231ps_fma(auVar201,auVar222,auVar187);
              auVar82._4_4_ = auVar222._4_4_ * auVar149._4_4_;
              auVar82._0_4_ = auVar222._0_4_ * auVar149._0_4_;
              auVar82._8_4_ = auVar222._8_4_ * auVar149._8_4_;
              auVar82._12_4_ = auVar222._12_4_ * auVar149._12_4_;
              auVar82._16_4_ = auVar222._16_4_ * auVar149._16_4_;
              auVar82._20_4_ = auVar222._20_4_ * auVar149._20_4_;
              auVar82._24_4_ = auVar222._24_4_ * auVar149._24_4_;
              auVar82._28_4_ = auVar149._28_4_;
              auVar10 = vfmsub231ps_fma(auVar82,auVar122,auVar21);
              auVar186 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar8),ZEXT1632(auVar10));
              auVar202 = vfmadd231ps_fma(ZEXT1632(auVar186),ZEXT1632(auVar9),auVar131);
              auVar128 = vrcpps_avx(ZEXT1632(auVar202));
              auVar232._8_4_ = 0x3f800000;
              auVar232._0_8_ = &DAT_3f8000003f800000;
              auVar232._12_4_ = 0x3f800000;
              auVar232._16_4_ = 0x3f800000;
              auVar232._20_4_ = 0x3f800000;
              auVar232._24_4_ = 0x3f800000;
              auVar232._28_4_ = 0x3f800000;
              auVar186 = vfnmadd213ps_fma(auVar128,ZEXT1632(auVar202),auVar232);
              auVar186 = vfmadd132ps_fma(ZEXT1632(auVar186),auVar128,auVar128);
              auVar83._4_4_ = auVar10._4_4_ * auVar20._4_4_;
              auVar83._0_4_ = auVar10._0_4_ * auVar20._0_4_;
              auVar83._8_4_ = auVar10._8_4_ * auVar20._8_4_;
              auVar83._12_4_ = auVar10._12_4_ * auVar20._12_4_;
              auVar83._16_4_ = auVar20._16_4_ * 0.0;
              auVar83._20_4_ = auVar20._20_4_ * 0.0;
              auVar83._24_4_ = auVar20._24_4_ * 0.0;
              auVar83._28_4_ = auVar130._28_4_;
              auVar8 = vfmadd231ps_fma(auVar83,ZEXT1632(auVar8),auVar130);
              auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar9),auVar147);
              fVar162 = auVar186._0_4_;
              fVar161 = auVar186._4_4_;
              fVar135 = auVar186._8_4_;
              fVar136 = auVar186._12_4_;
              auVar131 = ZEXT1632(CONCAT412(fVar136 * auVar8._12_4_,
                                            CONCAT48(fVar135 * auVar8._8_4_,
                                                     CONCAT44(fVar161 * auVar8._4_4_,
                                                              fVar162 * auVar8._0_4_))));
              uVar116 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar188._4_4_ = uVar116;
              auVar188._0_4_ = uVar116;
              auVar188._8_4_ = uVar116;
              auVar188._12_4_ = uVar116;
              auVar188._16_4_ = uVar116;
              auVar188._20_4_ = uVar116;
              auVar188._24_4_ = uVar116;
              auVar188._28_4_ = uVar116;
              auVar105._4_4_ = uStack_13c;
              auVar105._0_4_ = local_140;
              auVar105._8_4_ = uStack_138;
              auVar105._12_4_ = uStack_134;
              auVar105._16_4_ = uStack_130;
              auVar105._20_4_ = uStack_12c;
              auVar105._24_4_ = uStack_128;
              auVar105._28_4_ = uStack_124;
              auVar130 = vcmpps_avx(auVar105,auVar131,2);
              auVar128 = vcmpps_avx(auVar131,auVar188,2);
              auVar130 = vandps_avx(auVar128,auVar130);
              auVar186 = vpackssdw_avx(auVar130._0_16_,auVar130._16_16_);
              auVar219 = vpand_avx(auVar219,auVar186);
              auVar130 = vpmovsxwd_avx2(auVar219);
              if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar130 >> 0x7f,0) == '\0') &&
                    (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar130 >> 0xbf,0) == '\0') &&
                  (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar130[0x1f]) goto LAB_019920c2;
              auVar130 = vcmpps_avx(ZEXT1632(auVar202),ZEXT832(0) << 0x20,4);
              auVar202 = auVar130._16_16_;
              auVar186 = vpackssdw_avx(auVar130._0_16_,auVar202);
              auVar219 = vpand_avx(auVar219,auVar186);
              auVar130 = vpmovsxwd_avx2(auVar219);
              auVar189._8_8_ = uStack_5b8;
              auVar189._0_8_ = local_5c0;
              auVar189._16_8_ = uStack_5b0;
              auVar189._24_8_ = uStack_5a8;
              auVar219 = vpcmpeqd_avx(auVar202,auVar202);
              auVar223 = ZEXT1664(auVar219);
              if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar130 >> 0x7f,0) != '\0') ||
                    (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar130 >> 0xbf,0) != '\0') ||
                  (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar130[0x1f] < '\0') {
                auVar178 = ZEXT1632(CONCAT412(fVar136 * auVar5._12_4_,
                                              CONCAT48(fVar135 * auVar5._8_4_,
                                                       CONCAT44(fVar161 * auVar5._4_4_,
                                                                fVar162 * auVar5._0_4_))));
                auVar84._28_4_ = SUB84(uStack_5a8,4);
                auVar84._0_28_ =
                     ZEXT1628(CONCAT412(fVar136 * auVar6._12_4_,
                                        CONCAT48(fVar135 * auVar6._8_4_,
                                                 CONCAT44(fVar161 * auVar6._4_4_,
                                                          fVar162 * auVar6._0_4_))));
                auVar215._8_4_ = 0x3f800000;
                auVar215._0_8_ = &DAT_3f8000003f800000;
                auVar215._12_4_ = 0x3f800000;
                auVar215._16_4_ = 0x3f800000;
                auVar215._20_4_ = 0x3f800000;
                auVar215._24_4_ = 0x3f800000;
                auVar215._28_4_ = 0x3f800000;
                auVar128 = vsubps_avx(auVar215,auVar178);
                local_100 = vblendvps_avx(auVar128,auVar178,auVar176);
                auVar128 = vsubps_avx(auVar215,auVar84);
                local_260 = vblendvps_avx(auVar128,auVar84,auVar176);
                auVar180 = ZEXT3264(local_260);
                auVar189 = auVar130;
                local_520 = auVar131;
              }
            }
            auVar251 = ZEXT3264(local_860);
            auVar227 = ZEXT3264(local_820);
            if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar189 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar189 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar189 >> 0x7f,0) == '\0') &&
                  (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar189 >> 0xbf,0) == '\0') &&
                (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar189[0x1f]) goto LAB_01991d85;
            auVar130 = vsubps_avx(local_500,local_4e0);
            auVar219 = vfmadd213ps_fma(auVar130,local_100,local_4e0);
            fVar162 = *(float *)((long)local_868->ray_space + k * 4 + -0x10);
            auVar85._4_4_ = (auVar219._4_4_ + auVar219._4_4_) * fVar162;
            auVar85._0_4_ = (auVar219._0_4_ + auVar219._0_4_) * fVar162;
            auVar85._8_4_ = (auVar219._8_4_ + auVar219._8_4_) * fVar162;
            auVar85._12_4_ = (auVar219._12_4_ + auVar219._12_4_) * fVar162;
            auVar85._16_4_ = fVar162 * 0.0;
            auVar85._20_4_ = fVar162 * 0.0;
            auVar85._24_4_ = fVar162 * 0.0;
            auVar85._28_4_ = fVar162;
            auVar130 = vcmpps_avx(local_520,auVar85,6);
            auVar128 = auVar189 & auVar130;
            auVar216 = ZEXT3264(local_780);
            if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar128 >> 0x7f,0) != '\0') ||
                  (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar128 >> 0xbf,0) != '\0') ||
                (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar128[0x1f] < '\0') {
              local_2e0 = vandps_avx(auVar130,auVar189);
              auVar156._8_4_ = 0xbf800000;
              auVar156._0_8_ = 0xbf800000bf800000;
              auVar156._12_4_ = 0xbf800000;
              auVar156._16_4_ = 0xbf800000;
              auVar156._20_4_ = 0xbf800000;
              auVar156._24_4_ = 0xbf800000;
              auVar156._28_4_ = 0xbf800000;
              auVar179._8_4_ = 0x40000000;
              auVar179._0_8_ = 0x4000000040000000;
              auVar179._12_4_ = 0x40000000;
              auVar179._16_4_ = 0x40000000;
              auVar179._20_4_ = 0x40000000;
              auVar179._24_4_ = 0x40000000;
              auVar179._28_4_ = 0x40000000;
              auVar180 = ZEXT3264(auVar179);
              auVar219 = vfmadd213ps_fma(local_260,auVar179,auVar156);
              local_3a0 = local_100;
              local_260 = ZEXT1632(auVar219);
              auVar130 = local_260;
              local_380 = ZEXT1632(auVar219);
              local_360 = local_520;
              local_33c = iVar14;
              local_330 = local_890;
              uStack_328 = uStack_888;
              local_320 = local_710._0_8_;
              uStack_318 = local_710._8_8_;
              local_310 = local_720._0_8_;
              uStack_308 = local_720._8_8_;
              local_300 = local_700;
              uStack_2f8 = uStack_6f8;
              auVar115 = (undefined1  [8])(context->scene->geometries).items[uVar12].ptr;
              local_260 = auVar130;
              if ((((Geometry *)auVar115)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                auVar241 = ZEXT864(0);
                fVar162 = (float)local_340;
                local_2c0[0] = (fVar162 + local_100._0_4_ + 0.0) * local_160;
                local_2c0[1] = (fVar162 + local_100._4_4_ + 1.0) * fStack_15c;
                local_2c0[2] = (fVar162 + local_100._8_4_ + 2.0) * fStack_158;
                local_2c0[3] = (fVar162 + local_100._12_4_ + 3.0) * fStack_154;
                fStack_2b0 = (fVar162 + local_100._16_4_ + 4.0) * fStack_150;
                fStack_2ac = (fVar162 + local_100._20_4_ + 5.0) * fStack_14c;
                fStack_2a8 = (fVar162 + local_100._24_4_ + 6.0) * fStack_148;
                fStack_2a4 = fVar162 + local_100._28_4_ + 7.0;
                local_260._0_8_ = auVar219._0_8_;
                local_260._8_8_ = auVar219._8_8_;
                local_2a0 = local_260._0_8_;
                uStack_298 = local_260._8_8_;
                uStack_290 = 0;
                uStack_288 = 0;
                local_280 = local_520;
                auVar157._8_4_ = 0x7f800000;
                auVar157._0_8_ = 0x7f8000007f800000;
                auVar157._12_4_ = 0x7f800000;
                auVar157._16_4_ = 0x7f800000;
                auVar157._20_4_ = 0x7f800000;
                auVar157._24_4_ = 0x7f800000;
                auVar157._28_4_ = 0x7f800000;
                auVar130 = vblendvps_avx(auVar157,local_520,local_2e0);
                auVar128 = vshufps_avx(auVar130,auVar130,0xb1);
                auVar128 = vminps_avx(auVar130,auVar128);
                auVar131 = vshufpd_avx(auVar128,auVar128,5);
                auVar128 = vminps_avx(auVar128,auVar131);
                auVar131 = vpermpd_avx2(auVar128,0x4e);
                auVar128 = vminps_avx(auVar128,auVar131);
                auVar128 = vcmpps_avx(auVar130,auVar128,0);
                auVar131 = local_2e0 & auVar128;
                auVar130 = local_2e0;
                if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar131 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar131 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar131 >> 0x7f,0) != '\0') ||
                      (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar131 >> 0xbf,0) != '\0') ||
                    (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar131[0x1f] < '\0') {
                  auVar130 = vandps_avx(auVar128,local_2e0);
                }
                uVar109 = vmovmskps_avx(auVar130);
                uVar111 = 0;
                for (; (uVar109 & 1) == 0; uVar109 = uVar109 >> 1 | 0x80000000) {
                  uVar111 = uVar111 + 1;
                }
                uVar110 = (ulong)uVar111;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (((Geometry *)auVar115)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar162 = local_2c0[uVar110];
                  uVar116 = *(undefined4 *)((long)&local_2a0 + uVar110 * 4);
                  fVar135 = 1.0 - fVar162;
                  fVar161 = fVar135 * fVar135 * -3.0;
                  auVar219 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar135)),
                                             ZEXT416((uint)(fVar162 * fVar135)),ZEXT416(0xc0000000))
                  ;
                  auVar186 = vfmsub132ss_fma(ZEXT416((uint)(fVar162 * fVar135)),
                                             ZEXT416((uint)(fVar162 * fVar162)),ZEXT416(0x40000000))
                  ;
                  fVar135 = auVar219._0_4_ * 3.0;
                  fVar136 = auVar186._0_4_ * 3.0;
                  fVar137 = fVar162 * fVar162 * 3.0;
                  auVar194._0_4_ = fVar137 * (float)local_700._0_4_;
                  auVar194._4_4_ = fVar137 * (float)local_700._4_4_;
                  auVar194._8_4_ = fVar137 * (float)uStack_6f8;
                  auVar194._12_4_ = fVar137 * uStack_6f8._4_4_;
                  auVar168._4_4_ = fVar136;
                  auVar168._0_4_ = fVar136;
                  auVar168._8_4_ = fVar136;
                  auVar168._12_4_ = fVar136;
                  auVar219 = vfmadd132ps_fma(auVar168,auVar194,local_720);
                  auVar185._4_4_ = fVar135;
                  auVar185._0_4_ = fVar135;
                  auVar185._8_4_ = fVar135;
                  auVar185._12_4_ = fVar135;
                  auVar219 = vfmadd132ps_fma(auVar185,auVar219,local_710);
                  auVar169._4_4_ = fVar161;
                  auVar169._0_4_ = fVar161;
                  auVar169._8_4_ = fVar161;
                  auVar169._12_4_ = fVar161;
                  auVar219 = vfmadd132ps_fma(auVar169,auVar219,auVar7);
                  auVar180 = ZEXT1664(auVar219);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar110 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar219._0_4_;
                  uVar224 = vextractps_avx(auVar219,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar224;
                  uVar224 = vextractps_avx(auVar219,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar224;
                  *(float *)(ray + k * 4 + 0xf0) = fVar162;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar116;
                  *(uint *)(ray + k * 4 + 0x110) = uVar13;
                  *(uint *)(ray + k * 4 + 0x120) = uVar12;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_7e0._16_16_ = auVar147._16_16_;
                  local_7e0._0_16_ = local_710;
                  local_800._16_16_ = auVar20._16_16_;
                  local_800._0_16_ = local_720;
                  _local_740 = ZEXT1632(_local_700);
                  local_680 = ZEXT1632(*local_6e8);
                  _auStack_6b8 = auVar213._8_24_;
                  local_6c0 = auVar115;
                  local_600 = local_2e0;
                  _local_540 = *pauVar2;
                  do {
                    uVar116 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_400 = local_2c0[uVar110];
                    local_3f0._4_4_ = *(undefined4 *)((long)&local_2a0 + uVar110 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar110 * 4);
                    fVar135 = 1.0 - local_400;
                    auVar186 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar135)),
                                               ZEXT416((uint)(local_400 * fVar135)),
                                               ZEXT416(0xc0000000));
                    auVar219 = vfmsub132ss_fma(ZEXT416((uint)(local_400 * fVar135)),
                                               ZEXT416((uint)(local_400 * local_400)),
                                               ZEXT416(0x40000000));
                    fVar162 = auVar219._0_4_ * 3.0;
                    fVar161 = local_400 * local_400 * 3.0;
                    auVar195._0_4_ = fVar161 * (float)local_740._0_4_;
                    auVar195._4_4_ = fVar161 * (float)local_740._4_4_;
                    auVar195._8_4_ = fVar161 * (float)uStack_738;
                    auVar195._12_4_ = fVar161 * uStack_738._4_4_;
                    auVar170._4_4_ = fVar162;
                    auVar170._0_4_ = fVar162;
                    auVar170._8_4_ = fVar162;
                    auVar170._12_4_ = fVar162;
                    auVar219 = vfmadd132ps_fma(auVar170,auVar195,local_800._0_16_);
                    fVar162 = auVar186._0_4_ * 3.0;
                    auVar190._4_4_ = fVar162;
                    auVar190._0_4_ = fVar162;
                    auVar190._8_4_ = fVar162;
                    auVar190._12_4_ = fVar162;
                    auVar219 = vfmadd132ps_fma(auVar190,auVar219,local_7e0._0_16_);
                    fVar162 = fVar135 * fVar135 * -3.0;
                    local_7b0.context = context->user;
                    auVar171._4_4_ = fVar162;
                    auVar171._0_4_ = fVar162;
                    auVar171._8_4_ = fVar162;
                    auVar171._12_4_ = fVar162;
                    auVar219 = vfmadd132ps_fma(auVar171,auVar219,auVar7);
                    local_430 = auVar219._0_4_;
                    uStack_42c = local_430;
                    uStack_428 = local_430;
                    uStack_424 = local_430;
                    local_420 = vshufps_avx(auVar219,auVar219,0x55);
                    local_410 = vshufps_avx(auVar219,auVar219,0xaa);
                    fStack_3fc = local_400;
                    fStack_3f8 = local_400;
                    fStack_3f4 = local_400;
                    local_3f0._0_4_ = local_3f0._4_4_;
                    local_3f0._8_4_ = local_3f0._4_4_;
                    local_3f0._12_4_ = local_3f0._4_4_;
                    local_3e0 = CONCAT44(uStack_1cc,local_1d0);
                    uStack_3d8 = CONCAT44(uStack_1c4,uStack_1c8);
                    local_3d0._4_4_ = uStack_1bc;
                    local_3d0._0_4_ = local_1c0;
                    local_3d0._8_4_ = uStack_1b8;
                    local_3d0._12_4_ = uStack_1b4;
                    vpcmpeqd_avx2(ZEXT1632(local_3d0),ZEXT1632(local_3d0));
                    uStack_3bc = (local_7b0.context)->instID[0];
                    local_3c0 = uStack_3bc;
                    uStack_3b8 = uStack_3bc;
                    uStack_3b4 = uStack_3bc;
                    uStack_3b0 = (local_7b0.context)->instPrimID[0];
                    uStack_3ac = uStack_3b0;
                    uStack_3a8 = uStack_3b0;
                    uStack_3a4 = uStack_3b0;
                    local_880 = local_680._0_8_;
                    uStack_878 = local_680._8_8_;
                    local_7b0.valid = (int *)&local_880;
                    local_7b0.geometryUserPtr = ((Geometry *)auVar115)->userPtr;
                    local_7b0.hit = (RTCHitN *)&local_430;
                    local_7b0.N = 4;
                    local_7b0.ray = (RTCRayN *)ray;
                    if (((Geometry *)auVar115)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar219 = auVar223._0_16_;
                      auVar241 = ZEXT1664(auVar241._0_16_);
                      (*((Geometry *)auVar115)->intersectionFilterN)(&local_7b0);
                      auVar216 = ZEXT3264(local_780);
                      auVar251 = ZEXT3264(local_860);
                      auVar227 = ZEXT3264(local_820);
                      auVar219 = vpcmpeqd_avx(auVar219,auVar219);
                      auVar223 = ZEXT1664(auVar219);
                      auVar115 = local_6c0;
                      fVar228 = local_760;
                      fVar134 = fStack_75c;
                      fVar205 = fStack_758;
                      fVar206 = fStack_754;
                      fVar207 = fStack_750;
                      fVar208 = fStack_74c;
                      fVar209 = fStack_748;
                      fVar242 = (float)local_840;
                      fVar244 = local_840._4_4_;
                      fVar141 = (float)uStack_838;
                      fVar160 = uStack_838._4_4_;
                      fVar245 = (float)uStack_830;
                      fVar246 = uStack_830._4_4_;
                      fVar247 = (float)uStack_828;
                      fVar248 = uStack_828._4_4_;
                    }
                    auVar101._8_8_ = uStack_878;
                    auVar101._0_8_ = local_880;
                    auVar219 = auVar223._0_16_;
                    if (auVar101 == (undefined1  [16])0x0) {
                      auVar186 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar219 = auVar219 ^ auVar186;
                    }
                    else {
                      p_Var19 = context->args->filter;
                      if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((((Geometry *)auVar115)->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar241 = ZEXT1664(auVar241._0_16_);
                        (*p_Var19)(&local_7b0);
                        auVar216 = ZEXT3264(local_780);
                        auVar251 = ZEXT3264(local_860);
                        auVar227 = ZEXT3264(local_820);
                        auVar219 = vpcmpeqd_avx(auVar219,auVar219);
                        auVar223 = ZEXT1664(auVar219);
                        auVar115 = local_6c0;
                        fVar228 = local_760;
                        fVar134 = fStack_75c;
                        fVar205 = fStack_758;
                        fVar206 = fStack_754;
                        fVar207 = fStack_750;
                        fVar208 = fStack_74c;
                        fVar209 = fStack_748;
                        fVar242 = (float)local_840;
                        fVar244 = local_840._4_4_;
                        fVar141 = (float)uStack_838;
                        fVar160 = uStack_838._4_4_;
                        fVar245 = (float)uStack_830;
                        fVar246 = uStack_830._4_4_;
                        fVar247 = (float)uStack_828;
                        fVar248 = uStack_828._4_4_;
                      }
                      auVar102._8_8_ = uStack_878;
                      auVar102._0_8_ = local_880;
                      auVar186 = vpcmpeqd_avx(auVar102,_DAT_01feba10);
                      auVar219 = auVar223._0_16_ ^ auVar186;
                      if (auVar102 != (undefined1  [16])0x0) {
                        auVar186 = auVar223._0_16_ ^ auVar186;
                        auVar5 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])local_7b0.hit);
                        *(undefined1 (*) [16])(local_7b0.ray + 0xc0) = auVar5;
                        auVar5 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x10));
                        *(undefined1 (*) [16])(local_7b0.ray + 0xd0) = auVar5;
                        auVar5 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x20));
                        *(undefined1 (*) [16])(local_7b0.ray + 0xe0) = auVar5;
                        auVar5 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x30));
                        *(undefined1 (*) [16])(local_7b0.ray + 0xf0) = auVar5;
                        auVar5 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x40));
                        *(undefined1 (*) [16])(local_7b0.ray + 0x100) = auVar5;
                        auVar5 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x50));
                        *(undefined1 (*) [16])(local_7b0.ray + 0x110) = auVar5;
                        auVar5 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x60));
                        *(undefined1 (*) [16])(local_7b0.ray + 0x120) = auVar5;
                        auVar5 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x70));
                        *(undefined1 (*) [16])(local_7b0.ray + 0x130) = auVar5;
                        auVar186 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                            (local_7b0.hit + 0x80));
                        *(undefined1 (*) [16])(local_7b0.ray + 0x140) = auVar186;
                      }
                    }
                    auVar147 = local_520;
                    auVar144._8_8_ = 0x100000001;
                    auVar144._0_8_ = 0x100000001;
                    if ((auVar144 & auVar219) == (undefined1  [16])0x0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar116;
                    }
                    *(undefined4 *)(local_600 + uVar110 * 4) = 0;
                    uVar116 = *(undefined4 *)(ray + k * 4 + 0x80);
                    auVar132._4_4_ = uVar116;
                    auVar132._0_4_ = uVar116;
                    auVar132._8_4_ = uVar116;
                    auVar132._12_4_ = uVar116;
                    auVar132._16_4_ = uVar116;
                    auVar132._20_4_ = uVar116;
                    auVar132._24_4_ = uVar116;
                    auVar132._28_4_ = uVar116;
                    auVar20 = vcmpps_avx(auVar147,auVar132,2);
                    auVar130 = vandps_avx(auVar20,local_600);
                    auVar20 = local_600 & auVar20;
                    bVar94 = (auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar95 = (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar93 = (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar92 = SUB321(auVar20 >> 0x7f,0) != '\0';
                    bVar91 = (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar90 = SUB321(auVar20 >> 0xbf,0) != '\0';
                    bVar88 = (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar86 = auVar20[0x1f] < '\0';
                    if (((((((bVar94 || bVar95) || bVar93) || bVar92) || bVar91) || bVar90) ||
                        bVar88) || bVar86) {
                      auVar158._8_4_ = 0x7f800000;
                      auVar158._0_8_ = 0x7f8000007f800000;
                      auVar158._12_4_ = 0x7f800000;
                      auVar158._16_4_ = 0x7f800000;
                      auVar158._20_4_ = 0x7f800000;
                      auVar158._24_4_ = 0x7f800000;
                      auVar158._28_4_ = 0x7f800000;
                      auVar147 = vblendvps_avx(auVar158,auVar147,auVar130);
                      auVar20 = vshufps_avx(auVar147,auVar147,0xb1);
                      auVar20 = vminps_avx(auVar147,auVar20);
                      auVar128 = vshufpd_avx(auVar20,auVar20,5);
                      auVar20 = vminps_avx(auVar20,auVar128);
                      auVar128 = vpermpd_avx2(auVar20,0x4e);
                      local_600 = vminps_avx(auVar20,auVar128);
                      auVar20 = vcmpps_avx(auVar147,local_600,0);
                      auVar128 = auVar130 & auVar20;
                      auVar147 = auVar130;
                      if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar128 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar128 >> 0x7f,0) != '\0') ||
                            (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar128 >> 0xbf,0) != '\0') ||
                          (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar128[0x1f] < '\0') {
                        auVar147 = vandps_avx(auVar20,auVar130);
                      }
                      uVar109 = vmovmskps_avx(auVar147);
                      uVar111 = 0;
                      for (; (uVar109 & 1) == 0; uVar109 = uVar109 >> 1 | 0x80000000) {
                        uVar111 = uVar111 + 1;
                      }
                      uVar110 = (ulong)uVar111;
                    }
                    auVar180 = ZEXT3264(local_600);
                    local_600 = auVar130;
                  } while (((((((bVar94 || bVar95) || bVar93) || bVar92) || bVar91) || bVar90) ||
                           bVar88) || bVar86);
                }
              }
            }
          }
          lVar114 = lVar114 + 8;
        } while ((int)lVar114 < iVar14);
      }
      uVar116 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar129._4_4_ = uVar116;
      auVar129._0_4_ = uVar116;
      auVar129._8_4_ = uVar116;
      auVar129._12_4_ = uVar116;
      auVar129._16_4_ = uVar116;
      auVar129._20_4_ = uVar116;
      auVar129._24_4_ = uVar116;
      auVar129._28_4_ = uVar116;
      auVar147 = vcmpps_avx(local_80,auVar129,2);
      uVar111 = vmovmskps_avx(auVar147);
      uVar108 = uVar108 & uVar108 + 0xff & uVar111;
    } while (uVar108 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }